

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  short sVar1;
  short sVar2;
  _func_int *p_Var3;
  Layer *pLVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [36];
  Option OVar13;
  undefined8 uVar14;
  Option OVar15;
  undefined1 auVar16 [36];
  int n_2;
  int iVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  short asVar25 [4];
  long lVar26;
  short asVar27 [4];
  uint uVar28;
  short asVar29 [4];
  ulong uVar30;
  undefined1 *puVar31;
  ulong uVar32;
  void *pvVar33;
  void *pvVar34;
  long lVar35;
  short asVar36 [4];
  undefined8 *puVar37;
  byte bVar38;
  int j_2;
  undefined1 (*pauVar39) [16];
  int tiles;
  undefined1 (*pauVar40) [16];
  long lVar41;
  int iVar42;
  int iVar44;
  int iVar43;
  ulong uVar45;
  long lVar46;
  short asVar47 [4];
  short asVar48 [4];
  int iVar49;
  long lVar50;
  short asVar51 [4];
  long lVar52;
  int *piVar53;
  int j_1;
  uint uVar54;
  uint uVar55;
  undefined8 *puVar56;
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [64];
  undefined1 (*pauVar59) [32];
  short asVar60 [4];
  int *piVar61;
  int u_1;
  undefined1 *puVar62;
  ulong uVar63;
  ulong uVar64;
  Allocator *pAVar65;
  size_t sVar66;
  size_t sVar67;
  int i;
  int iVar68;
  undefined1 (*pauVar69) [16];
  long lVar70;
  ulong uVar71;
  long lVar72;
  short asVar73 [4];
  short asVar74 [4];
  short asVar75 [4];
  short asVar76 [4];
  void *pvVar77;
  int v_1;
  undefined1 *puVar78;
  ulong uVar79;
  short asVar80 [4];
  size_t sVar81;
  void *pvVar82;
  int iVar83;
  short asVar84 [4];
  long lVar85;
  void *pvVar86;
  int u;
  int iVar87;
  uint uVar88;
  uint uVar89;
  ulong uVar90;
  long lVar91;
  int i_2;
  int iVar92;
  undefined1 (*pauVar93) [16];
  short asVar94 [4];
  short asVar95 [4];
  int i_5;
  uint uVar96;
  short asVar97 [4];
  short asVar98 [4];
  void *pvVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined4 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  void *local_720;
  void *local_710;
  void *local_708;
  void *local_6f8;
  void *local_6d8;
  undefined8 uStack_6d0;
  int *local_6b0;
  Mat local_698;
  short local_650 [4];
  void *local_648;
  short local_640 [4];
  short local_638 [4];
  short local_630 [4];
  Mat local_628;
  short d0 [4];
  Mat local_588;
  short local_538 [4];
  ulong local_530;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short d1 [4];
  int *piStack_500;
  size_t sStack_4f8;
  Allocator *pAStack_4e8;
  int iStack_4dc;
  int iStack_4d8;
  undefined1 auStack_4ec [36];
  Option opt_b;
  size_t local_478;
  void *local_468;
  void *local_448;
  short w3 [4];
  short local_430 [2];
  short local_42c [2];
  short w2 [4];
  short local_420 [2];
  short local_41c [2];
  undefined1 auStack_418 [8];
  short local_410 [4];
  short local_408 [4];
  ulong local_400;
  short local_3f8 [4];
  undefined8 local_3f0;
  int aiStack_3e8 [4];
  Option opt_q;
  int aiStack_390 [2];
  undefined1 local_388 [16];
  undefined1 auStack_378 [80];
  undefined1 local_328 [16];
  undefined1 auStack_318 [80];
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [80];
  undefined1 local_268 [16];
  undefined1 auStack_258 [96];
  undefined1 auStack_1f8 [96];
  short w1 [4];
  ulong local_158;
  int o0 [2];
  Mat local_148;
  short w0 [4];
  short d3 [4];
  short d2 [4];
  
  local_148.elempack = bottom_blob->elempack;
  local_148.elemsize = bottom_blob->elemsize;
  piVar61 = bottom_blob->refcount;
  local_148.data = bottom_blob->data;
  local_148.refcount = bottom_blob->refcount;
  local_148.allocator = bottom_blob->allocator;
  local_148.dims = bottom_blob->dims;
  local_148.w = bottom_blob->w;
  local_148.h = bottom_blob->h;
  local_148.d = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar61 != (int *)0x0) {
    LOCK();
    *piVar61 = *piVar61 + 1;
    UNLOCK();
  }
  if (local_148.elempack == 0 || ((int)local_148.elemsize * 8) / local_148.elempack != 8) {
    auVar119 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar119 = vmovdqu64_avx512f(auVar119);
    opt_q._16_48_ = auVar119._16_48_;
    opt_q._0_8_ = auVar119._0_8_;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_148,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx512[-3]),
                     &opt_q);
  }
  local_698.cstep = 0;
  local_698.data = (void *)0x0;
  local_698.refcount._0_4_ = 0;
  local_698.refcount._4_4_ = 0;
  local_698.elemsize = 0;
  local_698.elempack = 0;
  local_698.allocator = (Allocator *)0x0;
  local_698.dims = 0;
  local_698.w = 0;
  local_698.h = 0;
  local_698.d = 0;
  local_698.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx512 +
             (long)this->_vptr_Convolution_x86_avx512[-3]),&local_148,&local_698,opt);
  iVar44 = local_698.elempack;
  iVar68 = -100;
  if ((local_698.data == (void *)0x0) || (local_698.cstep * (long)local_698.c == 0))
  goto LAB_001cb759;
  p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
  uVar55 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
  iVar87 = (~((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data)) + local_698.w) /
           *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) + 1;
  iVar83 = (~((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data)) + local_698.h) /
           *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) + 1;
  iVar17 = *(int *)(p_Var3 + 0x20 + (long)&(this->weight_winograd43_data).data);
  pauVar39 = (undefined1 (*) [16])0x0;
  if (opt->use_packing_layout == true) {
    if (iVar17 < 0x65) {
      uVar54 = (uint)((uVar55 & 3) == 0) * 3 + 1;
    }
    else {
      uVar54 = 1;
      if ((uVar55 & 7) == 0) {
        uVar54 = 8;
      }
    }
  }
  else {
    uVar54 = 1;
  }
  uVar96 = uVar54 * 4;
  if (100 < iVar17) {
    uVar96 = uVar54;
  }
  local_638 = (short  [4])(long)local_698.c;
  Mat::create(top_blob,iVar87,iVar83,(int)uVar55 / (int)uVar54,(ulong)uVar96,uVar54,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001cb759;
  if (opt->use_packing_layout == true) {
    local_640._0_4_ =
         (uint)(((byte)(this->_vptr_Convolution_x86_avx512[-3] + 0x30)
                       [(long)&(this->weight_winograd23_data).data] & 3) == 0) * 3 + 1;
    local_640[2] = 0;
    local_640[3] = 0;
  }
  else {
    local_640[0] = 1;
    local_640[1] = 0;
    local_640[2] = 0;
    local_640[3] = 0;
  }
  local_628.cstep = 0;
  local_628.data = (void *)0x0;
  local_628.refcount._0_4_ = 0;
  local_628.refcount._4_4_ = 0;
  local_628.elemsize = 0;
  local_628.elempack = 0;
  local_628.allocator = (Allocator *)0x0;
  local_628.dims = 0;
  local_628.w = 0;
  local_628.h = 0;
  local_628.d = 0;
  local_628.c = 0;
  iVar68 = local_640._0_4_;
  local_3f0 = top_blob;
  aiStack_3e8[3] = iVar17;
  Mat::create(&local_628,iVar87,iVar83,
              *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data) / iVar68,(ulong)(uint)(iVar68 * 4)
              ,iVar68,opt->workspace_allocator);
  auVar119 = _d1;
  iVar87 = local_628.c;
  uVar96 = local_628.h;
  uVar54 = local_628.w;
  uVar55 = local_698.c;
  iVar83 = local_698.w;
  iVar17 = local_698.elempack;
  iVar68 = -100;
  if ((local_628.data != (void *)0x0) && (local_628.cstep * (long)local_628.c != 0)) {
    if ((iVar44 != 8) || (local_640._0_4_ != 4)) goto LAB_001c901b;
    p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
    uVar28 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
    uVar20 = (ulong)uVar28;
    uVar129 = opt_q._60_4_;
    if ((uVar28 == 1) && (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)
       ) {
      if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
         (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1 ||
           (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1)) ||
          (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)))) {
        if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
            (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))))
        goto LAB_001c856f;
        opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
        opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
        opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
        Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                    local_698.elempack,opt->workspace_allocator);
        uVar45 = 0;
        uVar20 = (ulong)uVar54;
        if ((int)uVar54 < 1) {
          uVar20 = uVar45;
        }
        uVar22 = (ulong)uVar96;
        if ((int)uVar96 < 1) {
          uVar22 = uVar45;
        }
        uVar64 = (ulong)uVar55;
        if ((int)uVar55 < 1) {
          uVar64 = uVar45;
        }
        for (; uVar45 != uVar64; uVar45 = uVar45 + 1) {
          puVar56 = (undefined8 *)
                    (local_698.cstep * uVar45 * local_698.elemsize + (long)local_698.data);
          puVar37 = (undefined8 *)opt_q._0_8_;
          for (iVar68 = 0; uVar90 = uVar20, iVar68 != (int)uVar22; iVar68 = iVar68 + 1) {
            while (iVar17 = (int)uVar90, uVar90 = (ulong)(iVar17 - 1), iVar17 != 0) {
              *puVar37 = *puVar56;
              puVar56 = puVar56 + 2;
              puVar37 = puVar37 + 1;
            }
            puVar56 = puVar56 + (int)((iVar83 - uVar54) * 2);
          }
        }
        conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_q.blob_allocator == 0) {
            pvVar33 = (void *)opt_q._0_8_;
            if (opt_q._32_8_ == 0) goto LAB_001cd76e;
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
        goto LAB_001c901b;
      }
      conv1x1s1_sgemm_pack8to4_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
    }
    else {
LAB_001c856f:
      if ((((opt->use_winograd_convolution == true) && (uVar28 == 3)) &&
          (opt->use_winograd43_convolution != false)) &&
         ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
            (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
        asVar27[2] = 0;
        asVar27[3] = 0;
        asVar27[0] = (undefined2)local_698.elempack;
        asVar27[1] = local_698.elempack._2_2_;
        auVar102._4_4_ = local_628.h;
        auVar102._0_4_ = local_628.w;
        piVar61 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
        local_588.data = local_698.data;
        local_588.refcount._0_4_ = local_698.refcount._0_4_;
        local_588.refcount._4_4_ = local_698.refcount._4_4_;
        local_588.elemsize = local_698.elemsize;
        local_588.elempack = local_698.elempack;
        local_588.allocator = local_698.allocator;
        local_588.d = local_698.d;
        local_588.h = local_698.h;
        local_588.dims = local_698.dims;
        local_588.w = local_698.w;
        local_588.c = local_698.c;
        local_588.cstep = local_698.cstep;
        if (piVar61 != (int *)0x0) {
          LOCK();
          *piVar61 = *piVar61 + 1;
          UNLOCK();
        }
        auVar101._8_4_ = 3;
        auVar101._0_8_ = 0x300000003;
        auVar101._12_4_ = 3;
        auVar102._8_8_ = 0;
        auVar102 = vpaddd_avx512vl(auVar102,auVar101);
        auVar125 = vpsrad_avx(auVar102,0x1f);
        auVar125 = vpsrld_avx(auVar125,0x1e);
        auVar102 = vpaddd_avx(auVar102,auVar125);
        auVar140._8_4_ = 0xfffffffc;
        auVar140._0_8_ = 0xfffffffcfffffffc;
        auVar140._12_4_ = 0xfffffffc;
        auVar125 = vpandd_avx512vl(auVar102,auVar140);
        iVar92 = auVar125._0_4_ + 2;
        copy_make_border(&local_698,&local_588,0,(auVar125._4_4_ + 2) - local_698.h,0,
                         iVar92 - local_698.w,0,0.0,opt);
        auVar101 = vpsrad_avx512vl(auVar102,2);
        iVar68 = auVar101._0_4_;
        local_630[0] = (short)iVar68;
        local_630[1] = (short)((uint)iVar68 >> 0x10);
        iVar68 = iVar68 * 6;
        uVar96 = auVar101._4_4_;
        iVar83 = iVar68 * uVar96;
        local_648 = (void *)(ulong)(uint)(iVar17 * 2);
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        uVar54 = (uint)((long)iVar83 / 6);
        local_650 = asVar27;
        local_530 = (ulong)auVar125._0_4_;
        Mat::create((Mat *)d0,uVar54,0x24,uVar55,(size_t)local_648,iVar17,opt->workspace_allocator);
        lVar70 = (long)(int)(uVar54 * 8);
        lVar50 = (long)(int)(uVar54 << 4);
        pauVar19 = (undefined1 (*) [16])0x0;
        uVar20 = 0;
        if (0 < (int)local_630._0_4_) {
          uVar20 = (ulong)local_630 & 0xffffffff;
        }
        uStack_6d0 = auVar102._8_8_;
        local_6d8 = (void *)uVar20;
        pauVar21 = (undefined1 (*) [16])(ulong)uVar96;
        if ((int)uVar96 < 1) {
          pauVar21 = pauVar19;
        }
        pauVar93 = (undefined1 (*) [16])0x0;
        if (0 < (int)uVar55) {
          pauVar93 = (undefined1 (*) [16])(ulong)uVar55;
        }
        auVar126._8_2_ = 0xfffb;
        auVar126._0_8_ = 0xfffbfffbfffbfffb;
        auVar126._10_2_ = 0xfffb;
        auVar126._12_2_ = 0xfffb;
        auVar126._14_2_ = 0xfffb;
        pauVar39 = pauVar21;
        for (; pauVar19 != pauVar93; pauVar19 = (undefined1 (*) [16])(*pauVar19 + 1)) {
          pauVar39 = (undefined1 (*) [16])
                     ((long)local_588.data +
                     local_588.cstep * local_588.elemsize * (long)pauVar19 + 0x20);
          for (pauVar57 = (undefined1 (*) [16])0x0; pauVar57 != pauVar21;
              pauVar57 = (undefined1 (*) [16])(*pauVar57 + 1)) {
            pauVar18 = (undefined1 (*) [16])((long)((iVar68 * (int)pauVar57) / 6) * 0x10 + (long)d0)
            ;
            pauVar23 = pauVar39;
            for (uVar45 = 0; pauVar40 = pauVar23, lVar26 = -0x60, uVar45 != uVar20;
                uVar45 = uVar45 + 1) {
              for (; lVar46 = 0x50, pauVar69 = pauVar18, lVar26 != 0; lVar26 = lVar26 + 0x10) {
                auVar102 = pauVar40[-2];
                auVar101 = pauVar40[-1];
                auVar140 = *pauVar40;
                auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                auVar100 = vpcmpgtb_avx((undefined1  [16])0x0,auVar101);
                auVar136 = vpcmpgtb_avx((undefined1  [16])0x0,auVar140);
                auVar141 = vpunpcklbw_avx(auVar102,auVar103);
                auVar139 = vpunpckhbw_avx(auVar102,auVar103);
                auVar103 = vpunpcklbw_avx(auVar101,auVar100);
                auVar100 = vpunpckhbw_avx(auVar101,auVar100);
                auVar123 = vpunpcklbw_avx(auVar140,auVar136);
                auVar104 = vpunpckhbw_avx(auVar140,auVar136);
                auVar102 = vpsllw_avx(auVar141,2);
                auVar102 = vpaddw_avx(auVar102,auVar123);
                auVar101 = vpmullw_avx(auVar103,auVar126);
                auVar102 = vpaddw_avx(auVar102,auVar101);
                auVar101 = vpaddw_avx(auVar123,auVar100);
                auVar140 = vpaddw_avx(auVar103,auVar139);
                auVar140 = vpsllw_avx(auVar140,2);
                auVar136 = vpsubw_avx(auVar101,auVar140);
                auVar101 = vpsubw_avx(auVar123,auVar100);
                auVar140 = vpsubw_avx(auVar139,auVar103);
                auVar140 = vpsllw_avx(auVar140,2);
                auVar101 = vpaddw_avx(auVar101,auVar140);
                auVar103 = vpsubw_avx(auVar123,auVar103);
                auVar140 = vpsubw_avx(auVar139,auVar100);
                auVar140 = vpaddw_avx(auVar140,auVar140);
                auVar141 = vpsubw_avx(auVar103,auVar140);
                auVar140 = vpaddw_avx(auVar103,auVar140);
                auVar103 = vpsllw_avx(auVar139,2);
                auVar103 = vpaddw_avx(auVar103,auVar104);
                auVar100 = vpmullw_avx(auVar100,auVar126);
                auVar103 = vpaddw_avx(auVar103,auVar100);
                *(undefined1 (*) [16])(auStack_378 + lVar26) = auVar102;
                *(undefined1 (*) [16])(auStack_318 + lVar26) = auVar136;
                *(undefined1 (*) [16])(auStack_2b8 + lVar26) = auVar101;
                *(undefined1 (*) [16])(auStack_258 + lVar26) = auVar141;
                *(undefined1 (*) [16])(auStack_1f8 + lVar26) = auVar140;
                *(undefined1 (*) [16])((long)w1 + lVar26) = auVar103;
                pauVar40 = (undefined1 (*) [16])(*pauVar40 + iVar92 * 8);
              }
              for (; lVar46 != 0x290; lVar46 = lVar46 + 0x60) {
                auVar102 = *(undefined1 (*) [16])(auStack_418 + lVar46);
                auVar101 = *(undefined1 (*) [16])((long)local_408 + lVar46);
                auVar140 = *(undefined1 (*) [16])((long)local_3f8 + lVar46);
                auVar103 = *(undefined1 (*) [16])((long)aiStack_3e8 + lVar46);
                auVar100 = vpsllw_avx512vl(*(undefined1 (*) [16])((long)w2 + lVar46),2);
                auVar136 = vpmullw_avx(auVar101,auVar126);
                auVar100 = vpaddw_avx(auVar100,auVar103);
                auVar100 = vpaddw_avx(auVar136,auVar100);
                auVar136 = vpaddw_avx(auVar103,auVar140);
                auVar141 = vpaddw_avx(auVar101,auVar102);
                auVar141 = vpsllw_avx(auVar141,2);
                auVar141 = vpsubw_avx(auVar136,auVar141);
                auVar136 = vpsubw_avx(auVar103,auVar140);
                auVar139 = vpsubw_avx(auVar102,auVar101);
                auVar139 = vpsllw_avx(auVar139,2);
                auVar136 = vpaddw_avx(auVar139,auVar136);
                auVar103 = vpsubw_avx(auVar103,auVar101);
                auVar101 = vpsubw_avx(auVar102,auVar140);
                auVar101 = vpaddw_avx(auVar101,auVar101);
                auVar139 = vpsubw_avx(auVar103,auVar101);
                auVar101 = vpaddw_avx(auVar103,auVar101);
                auVar103 = vpsllw_avx(auVar102,2);
                auVar102 = vpmullw_avx(auVar140,auVar126);
                auVar102 = vpaddw_avx(auVar102,auVar103);
                auVar102 = vpaddw_avx(auVar102,*(undefined1 (*) [16])(&opt_q.lightmode + lVar46));
                *pauVar69 = auVar100;
                *(undefined1 (*) [16])(*pauVar69 + lVar70 * 2) = auVar141;
                *(undefined1 (*) [16])(*pauVar69 + lVar50 * 2) = auVar136;
                *(undefined1 (*) [16])(*pauVar69 + (long)(int)(uVar54 * 0x18) * 2) = auVar139;
                *(undefined1 (*) [16])(*pauVar69 + (long)(int)(uVar54 << 5) * 2) = auVar101;
                *(undefined1 (*) [16])(*pauVar69 + (long)(int)(uVar54 * 0x28) * 2) = auVar102;
                pauVar69 = (undefined1 (*) [16])(*pauVar69 + (long)(int)(uVar54 * 0x30) * 2);
              }
              pauVar23 = pauVar23 + 2;
              pauVar18 = pauVar18 + 1;
            }
            pauVar39 = (undefined1 (*) [16])(*pauVar39 + (long)local_588.w * local_588.elemsize * 4)
            ;
          }
        }
        piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
        if (piVar61 != (int *)0x0) {
          LOCK();
          *piVar61 = *piVar61 + -1;
          UNLOCK();
          if (*piVar61 == 0) {
            if (local_588.allocator == (Allocator *)0x0) {
              free(local_588.data);
            }
            else {
              (**(code **)(*(long *)local_588.allocator + 0x18))();
            }
          }
        }
        auVar12 = (undefined1  [36])opt_q._28_36_;
        local_588.cstep = 0;
        local_588.data = (void *)0x0;
        local_588.refcount._0_4_ = 0;
        local_588.refcount._4_4_ = 0;
        local_588.elemsize = 0;
        local_588.elempack = 0;
        local_588.h = 0;
        local_588.d = 0;
        local_588.c = 0;
        local_588.allocator = (Allocator *)0x0;
        local_588.dims = 0;
        local_588.w = 0;
        _d1 = SUB1612((undefined1  [16])0x0,0);
        _d1 = ZEXT1228(_d1);
        auStack_4ec._32_4_ = auVar119._60_4_;
        _d1 = ZEXT3260(_d1);
        opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
        opt_q._60_4_ = auVar12._32_4_;
        opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
        if (iVar83 < 0x18) {
          uVar96 = uVar54;
          if (0xb < iVar83) {
            uVar55 = uVar55 * 2;
            uVar96 = (uVar54 & 1) + 1;
          }
        }
        else {
          uVar55 = uVar55 << 2;
          uVar96 = (uVar54 & 1) + (int)(((long)iVar83 / 6 & 0xffffffffU) >> 2) +
                   (uint)((uVar54 >> 1 & 1) != 0);
        }
        Mat::create((Mat *)&opt_q,uVar55,uVar96,0x24,(size_t)local_648,local_650._0_4_,
                    opt->workspace_allocator);
        lVar26 = (long)(int)uVar54;
        for (lVar46 = 0; lVar46 != 0x24; lVar46 = lVar46 + 1) {
          lVar72 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
          lVar85 = lVar46 * lVar26;
          for (uVar45 = 0; (long)(uVar45 | 3) < lVar26; uVar45 = uVar45 + 4) {
            pauVar58 = (undefined1 (*) [64])((uVar45 >> 2) * lVar72 + opt_q._0_8_);
            pauVar19 = pauVar93;
            while (iVar17 = (int)pauVar19, pauVar19 = (undefined1 (*) [16])(ulong)(iVar17 - 1),
                  iVar17 != 0) {
              auVar119 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((uVar45 + lVar85) * 0x10 + (long)d0));
              auVar119 = vmovdqu64_avx512f(auVar119);
              *pauVar58 = auVar119;
              pauVar58 = pauVar58 + 1;
            }
          }
          for (; (long)(uVar45 | 1) < lVar26; uVar45 = uVar45 + 2) {
            pauVar59 = (undefined1 (*) [32])
                       ((ulong)(((uint)(uVar45 >> 2) & 0x3fffffff) +
                               (uint)(((uint)uVar45 >> 1 & 1) != 0)) * lVar72 + opt_q._0_8_);
            pauVar19 = pauVar93;
            while (iVar17 = (int)pauVar19, pauVar19 = (undefined1 (*) [16])(ulong)(iVar17 - 1),
                  iVar17 != 0) {
              *pauVar59 = *(undefined1 (*) [32])((uVar45 + lVar85) * 0x10 + (long)d0);
              pauVar59 = pauVar59 + 1;
            }
          }
          for (; (long)uVar45 < lVar26; uVar45 = uVar45 + 1) {
            pauVar57 = (undefined1 (*) [16])
                       ((ulong)(((uint)uVar45 & 1) + ((uint)(uVar45 >> 2) & 0x3fffffff) +
                               (uint)(((uint)uVar45 >> 1 & 1) != 0)) * lVar72 + opt_q._0_8_);
            pauVar19 = pauVar93;
            while (iVar17 = (int)pauVar19, pauVar19 = (undefined1 (*) [16])(ulong)(iVar17 - 1),
                  iVar17 != 0) {
              *pauVar57 = *(undefined1 (*) [16])((uVar45 + lVar85) * 0x10 + (long)d0);
              pauVar57 = pauVar57 + 1;
            }
          }
        }
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        Mat::create((Mat *)d1,uVar54,0x24,iVar87,0x10,4,opt->workspace_allocator);
        uVar22 = 0;
        uVar45 = 0;
        if (0 < iVar87) {
          uVar45 = (ulong)(uint)iVar87;
        }
        auVar5 = vpmovsxbw_avx2(_DAT_004bbc00);
        auVar6 = vpmovsxbw_avx2(_DAT_004bbc10);
        auVar7 = vpmovsxbw_avx2(_DAT_004bbc20);
        auVar8 = vpmovsxbw_avx2(_DAT_004bbc30);
        for (; uVar22 != uVar45; uVar22 = uVar22 + 1) {
          iVar17 = (this->weight_winograd43_data).w;
          sVar81 = (this->weight_winograd43_data).elemsize;
          pvVar33 = (void *)(sVar81 * (this->weight_winograd43_data).cstep * uVar22 +
                            (long)(this->weight_winograd43_data).data);
          asVar27 = d1;
          for (lVar46 = 0; lVar46 != 0x24; lVar46 = lVar46 + 1) {
            lVar85 = (long)(int)opt_q._44_4_;
            lVar72 = opt_q._0_8_;
            for (pauVar39 = (undefined1 (*) [16])0x0; (long)((ulong)pauVar39 | 3) < lVar26;
                pauVar39 = (undefined1 (*) [16])(*pauVar39 + 4)) {
              auVar119 = ZEXT1664((undefined1  [16])0x0);
              lVar52 = 0;
              auVar132 = ZEXT1664((undefined1  [16])0x0);
              auVar134 = ZEXT1664((undefined1  [16])0x0);
              auVar137 = ZEXT1664((undefined1  [16])0x0);
              pauVar19 = pauVar93;
              while( true ) {
                iVar83 = (int)pauVar19;
                pauVar19 = (undefined1 (*) [16])(ulong)(iVar83 - 1);
                if (iVar83 == 0) break;
                auVar117 = *(undefined1 (*) [32])((long)pvVar33 + lVar52);
                auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar52 + 0x20);
                auVar116 = *(undefined1 (*) [32])(lVar72 + 0x20 + lVar52);
                auVar105 = vpermw_avx512vl(auVar5,*(undefined1 (*) [32])(lVar72 + lVar52));
                auVar114 = vpshufd_avx2(auVar105,0x50);
                auVar115 = vpmullw_avx2(auVar117,auVar114);
                auVar114 = vpmulhw_avx2(auVar117,auVar114);
                auVar105 = vpshufd_avx2(auVar105,0xfa);
                auVar9 = vpmullw_avx2(auVar117,auVar105);
                auVar105 = vpmulhw_avx2(auVar117,auVar105);
                auVar106 = vpermw_avx512vl(auVar6,*(undefined1 (*) [32])(lVar72 + lVar52));
                auVar107 = vpshufd_avx512vl(auVar106,0x50);
                auVar108 = vpmullw_avx512vl(auVar118,auVar107);
                auVar107 = vpmulhw_avx512vl(auVar118,auVar107);
                auVar106 = vpshufd_avx2(auVar106,0xfa);
                auVar109 = vpmullw_avx512vl(auVar118,auVar106);
                auVar106 = vpmulhw_avx2(auVar118,auVar106);
                auVar110 = vpunpcklwd_avx512vl(auVar115,auVar114);
                auVar110 = vpaddd_avx512vl(auVar110,auVar137._0_32_);
                auVar111 = vpunpcklwd_avx512vl(auVar9,auVar105);
                auVar111 = vpaddd_avx512vl(auVar111,auVar134._0_32_);
                auVar112 = vpunpcklwd_avx512vl(auVar108,auVar107);
                auVar113 = vpunpcklwd_avx512vl(auVar109,auVar106);
                auVar114 = vpunpckhwd_avx2(auVar115,auVar114);
                auVar114 = vpaddd_avx512vl(auVar112,auVar114);
                auVar114 = vpaddd_avx2(auVar114,auVar110);
                auVar105 = vpunpckhwd_avx2(auVar9,auVar105);
                auVar105 = vpaddd_avx512vl(auVar105,auVar113);
                auVar105 = vpaddd_avx2(auVar105,auVar111);
                auVar115 = vpunpckhwd_avx512vl(auVar108,auVar107);
                auVar114 = vpaddd_avx2(auVar115,auVar114);
                auVar137 = ZEXT3264(auVar114);
                auVar114 = vpunpckhwd_avx512vl(auVar109,auVar106);
                auVar114 = vpaddd_avx2(auVar114,auVar105);
                auVar134 = ZEXT3264(auVar114);
                auVar105 = vpermw_avx512vl(auVar5,auVar116);
                auVar114 = vpshufd_avx2(auVar105,0x50);
                auVar9 = vpmullw_avx2(auVar117,auVar114);
                auVar114 = vpmulhw_avx2(auVar117,auVar114);
                auVar105 = vpshufd_avx2(auVar105,0xfa);
                auVar107 = vpmullw_avx2(auVar117,auVar105);
                auVar105 = vpmulhw_avx2(auVar117,auVar105);
                auVar116 = vpermw_avx512vl(auVar6,auVar116);
                auVar117 = vpshufd_avx2(auVar116,0x50);
                auVar108 = vpmullw_avx2(auVar118,auVar117);
                auVar106 = vpmulhw_avx2(auVar118,auVar117);
                auVar117 = vpshufd_avx2(auVar116,0xfa);
                auVar110 = vpmullw_avx512vl(auVar118,auVar117);
                auVar115 = vpmulhw_avx2(auVar118,auVar117);
                auVar117 = vpunpcklwd_avx2(auVar9,auVar114);
                auVar117 = vpaddd_avx2(auVar117,auVar132._0_32_);
                auVar118 = vpunpcklwd_avx2(auVar107,auVar105);
                auVar118 = vpaddd_avx2(auVar118,auVar119._0_32_);
                auVar109 = vpunpcklwd_avx2(auVar108,auVar106);
                auVar111 = vpunpcklwd_avx512vl(auVar110,auVar115);
                auVar116 = vpunpckhwd_avx2(auVar9,auVar114);
                auVar116 = vpaddd_avx2(auVar109,auVar116);
                auVar117 = vpaddd_avx2(auVar116,auVar117);
                auVar116 = vpunpckhwd_avx2(auVar107,auVar105);
                auVar116 = vpaddd_avx512vl(auVar111,auVar116);
                auVar118 = vpaddd_avx2(auVar116,auVar118);
                auVar116 = vpunpckhwd_avx2(auVar108,auVar106);
                auVar117 = vpaddd_avx2(auVar116,auVar117);
                auVar132 = ZEXT3264(auVar117);
                auVar117 = vpunpckhwd_avx512vl(auVar110,auVar115);
                auVar117 = vpaddd_avx2(auVar117,auVar118);
                auVar119 = ZEXT3264(auVar117);
                lVar52 = lVar52 + 0x40;
              }
              auVar118._0_16_ = ZEXT116(0) * auVar134._0_16_ + ZEXT116(1) * auVar137._0_16_;
              auVar118._16_16_ = ZEXT116(0) * auVar137._16_16_ + ZEXT116(1) * auVar134._0_16_;
              auVar117 = vperm2i128_avx2(auVar137._0_32_,auVar134._0_32_,0x31);
              auVar117 = vpaddd_avx2(auVar118,auVar117);
              auVar116._0_16_ = ZEXT116(0) * auVar119._0_16_ + ZEXT116(1) * auVar132._0_16_;
              auVar116._16_16_ = ZEXT116(0) * auVar132._16_16_ + ZEXT116(1) * auVar119._0_16_;
              auVar118 = vperm2i128_avx2(auVar132._0_32_,auVar119._0_32_,0x31);
              auVar118 = vpaddd_avx2(auVar116,auVar118);
              *(undefined1 (*) [32])asVar27 = auVar117;
              *(undefined1 (*) [32])((long)asVar27 + 0x20) = auVar118;
              asVar27 = (short  [4])((long)asVar27 + 0x40);
              lVar72 = lVar72 + (long)opt_q.workspace_allocator * lVar85;
            }
            uVar55 = 0;
            for (; (int)((uint)pauVar39 | 1) < (int)uVar54;
                pauVar39 = (undefined1 (*) [16])(ulong)((uint)pauVar39 + 2)) {
              auVar119 = ZEXT1664((undefined1  [16])0x0);
              lVar72 = 0;
              auVar132 = ZEXT1664((undefined1  [16])0x0);
              pauVar19 = pauVar93;
              while( true ) {
                iVar83 = (int)pauVar19;
                pauVar19 = (undefined1 (*) [16])(ulong)(iVar83 - 1);
                if (iVar83 == 0) break;
                auVar117 = *(undefined1 (*) [32])
                            ((ulong)((uVar55 & 1) + ((uint)((ulong)pauVar39 >> 2) & 0x3fffffff)) *
                             lVar85 * (long)opt_q.workspace_allocator + opt_q._0_8_ + lVar72);
                auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar72 * 2);
                auVar116 = *(undefined1 (*) [32])((long)pvVar33 + lVar72 * 2 + 0x20);
                auVar105 = vpermw_avx512vl(auVar5,auVar117);
                auVar114 = vpshufd_avx2(auVar105,0x50);
                auVar9 = vpmullw_avx2(auVar114,auVar118);
                auVar114 = vpmulhw_avx2(auVar114,auVar118);
                auVar105 = vpshufd_avx2(auVar105,0xfa);
                auVar107 = vpmullw_avx2(auVar105,auVar118);
                auVar105 = vpmulhw_avx2(auVar105,auVar118);
                auVar118 = vpermw_avx512vl(auVar6,auVar117);
                auVar117 = vpshufd_avx2(auVar118,0x50);
                auVar108 = vpmullw_avx2(auVar116,auVar117);
                auVar106 = vpmulhw_avx2(auVar116,auVar117);
                auVar117 = vpshufd_avx2(auVar118,0xfa);
                auVar109 = vpmullw_avx2(auVar116,auVar117);
                auVar115 = vpmulhw_avx2(auVar116,auVar117);
                auVar117 = vpunpcklwd_avx2(auVar9,auVar114);
                auVar117 = vpaddd_avx2(auVar117,auVar132._0_32_);
                auVar118 = vpunpcklwd_avx2(auVar107,auVar105);
                auVar118 = vpaddd_avx2(auVar118,auVar119._0_32_);
                auVar110 = vpunpcklwd_avx2(auVar108,auVar106);
                auVar111 = vpunpcklwd_avx2(auVar109,auVar115);
                auVar116 = vpunpckhwd_avx2(auVar9,auVar114);
                auVar116 = vpaddd_avx2(auVar110,auVar116);
                auVar117 = vpaddd_avx2(auVar116,auVar117);
                auVar116 = vpunpckhwd_avx2(auVar107,auVar105);
                auVar116 = vpaddd_avx2(auVar111,auVar116);
                auVar118 = vpaddd_avx2(auVar118,auVar116);
                auVar116 = vpunpckhwd_avx2(auVar108,auVar106);
                auVar117 = vpaddd_avx2(auVar117,auVar116);
                auVar132 = ZEXT3264(auVar117);
                auVar117 = vpunpckhwd_avx2(auVar109,auVar115);
                auVar117 = vpaddd_avx2(auVar118,auVar117);
                auVar119 = ZEXT3264(auVar117);
                lVar72 = lVar72 + 0x20;
              }
              auVar114._0_16_ = ZEXT116(0) * auVar119._0_16_ + ZEXT116(1) * auVar132._0_16_;
              auVar114._16_16_ = ZEXT116(0) * auVar132._16_16_ + ZEXT116(1) * auVar119._0_16_;
              auVar117 = vperm2i128_avx2(auVar132._0_32_,auVar119._0_32_,0x31);
              auVar117 = vpaddd_avx2(auVar114,auVar117);
              *(undefined1 (*) [32])asVar27 = auVar117;
              asVar27 = (short  [4])((long)asVar27 + 0x20);
              uVar55 = (uint)(byte)((char)uVar55 + 1);
            }
            while( true ) {
              uVar55 = (uint)pauVar39;
              if ((int)uVar54 <= (int)uVar55) break;
              auVar119 = ZEXT1664((undefined1  [16])0x0);
              lVar72 = 0;
              pauVar19 = pauVar93;
              while (iVar83 = (int)pauVar19, pauVar19 = (undefined1 (*) [16])(ulong)(iVar83 - 1),
                    iVar83 != 0) {
                auVar117 = *(undefined1 (*) [32])((long)pvVar33 + lVar72 * 4);
                auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar72 * 4 + 0x20);
                auVar114 = ZEXT1632(*(undefined1 (*) [16])
                                     ((ulong)((uVar55 & 1) +
                                              ((uint)((ulong)pauVar39 >> 2) & 0x3fffffff) +
                                             (uint)((uVar55 >> 1 & 1) != 0)) * lVar85 *
                                      (long)opt_q.workspace_allocator + opt_q._0_8_ + lVar72));
                auVar116 = vpermw_avx512vl(auVar7,auVar114);
                auVar114 = vpermw_avx512vl(auVar8,auVar114);
                auVar105 = vpmullw_avx2(auVar116,auVar117);
                auVar116 = vpmulhw_avx2(auVar116,auVar117);
                auVar106 = vpmullw_avx2(auVar118,auVar114);
                auVar114 = vpmulhw_avx2(auVar118,auVar114);
                auVar117 = vpunpcklwd_avx2(auVar105,auVar116);
                auVar117 = vpaddd_avx2(auVar119._0_32_,auVar117);
                auVar115 = vpunpcklwd_avx2(auVar106,auVar114);
                auVar118 = vpunpckhwd_avx2(auVar105,auVar116);
                auVar118 = vpaddd_avx2(auVar115,auVar118);
                auVar117 = vpaddd_avx2(auVar117,auVar118);
                auVar118 = vpunpckhwd_avx2(auVar106,auVar114);
                auVar117 = vpaddd_avx2(auVar117,auVar118);
                auVar119 = ZEXT3264(auVar117);
                lVar72 = lVar72 + 0x10;
              }
              auVar102 = vpaddd_avx(auVar119._0_16_,auVar119._16_16_);
              *(undefined1 (*) [16])asVar27 = auVar102;
              asVar27 = (short  [4])((long)asVar27 + 0x10);
              pauVar39 = (undefined1 (*) [16])(ulong)(uVar55 + 1);
            }
            pvVar33 = (void *)((long)pvVar33 + (long)iVar17 * sVar81);
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_q.blob_allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        auVar12 = (undefined1  [36])opt_b._28_36_;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        local_478 = 0;
        opt_b._0_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_b._0_28_ = ZEXT1228((undefined1  [12])opt_b._0_12_);
        opt_b._60_4_ = auVar12._32_4_;
        uVar129 = opt_b._60_4_;
        opt_b._0_60_ = ZEXT3260((undefined1  [32])opt_b._0_32_);
        OVar13 = opt_b;
        auVar103._4_4_ = local_628.h;
        auVar103._0_4_ = local_628.w;
        auVar103._8_8_ = 0;
        uVar22 = vpcmpd_avx512vl(auVar103,auVar125,4);
        if ((uVar22 & 3) == 0) {
          piVar61 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
          if (piVar61 != (int *)0x0) {
            LOCK();
            *piVar61 = *piVar61 + 1;
            UNLOCK();
          }
          opt_b.blob_allocator._4_4_ = local_628.refcount._4_4_;
          opt_b.blob_allocator._0_4_ = local_628.refcount._0_4_;
          opt_b._0_8_ = local_628.data;
          opt_b.workspace_allocator = (Allocator *)local_628.elemsize;
          opt_b._28_36_ = OVar13._28_36_;
          opt_b.openmp_blocktime = local_628.elempack;
          opt_b._32_8_ = local_628.allocator;
          opt_b.use_subgroup_shuffle = (bool)(undefined1)local_628.w;
          opt_b.use_image_storage = (bool)local_628.w._1_1_;
          opt_b.use_tensor_storage = (bool)local_628.w._2_1_;
          opt_b.use_reserved_0 = (bool)local_628.w._3_1_;
          opt_b.use_shader_pack8 = (bool)(undefined1)local_628.dims;
          opt_b.use_subgroup_basic = (bool)local_628.dims._1_1_;
          opt_b.use_subgroup_vote = (bool)local_628.dims._2_1_;
          opt_b.use_subgroup_ballot = (bool)local_628.dims._3_1_;
          opt_b.use_local_pool_allocator = (bool)(undefined1)local_628.d;
          opt_b.use_shader_local_memory = (bool)local_628.d._1_1_;
          opt_b.use_cooperative_matrix = (bool)local_628.d._2_1_;
          opt_b.use_winograd23_convolution = (bool)local_628.d._3_1_;
          opt_b.flush_denormals = local_628.h;
          opt_b.use_winograd43_convolution = (bool)(undefined1)local_628.c;
          opt_b.use_winograd63_convolution = (bool)local_628.c._1_1_;
          opt_b.use_reserved_6 = (bool)local_628.c._2_1_;
          opt_b.use_reserved_7 = (bool)local_628.c._3_1_;
          opt_b = (Option)CONCAT460(uVar129,opt_b._0_60_);
          local_478 = local_628.cstep;
        }
        else {
          Mat::create((Mat *)&opt_b,(int)local_530,auVar125._4_4_,iVar87,0x10,4,
                      opt->workspace_allocator);
        }
        for (uVar22 = 0; uVar22 != uVar45; uVar22 = uVar22 + 1) {
          pauVar39 = (undefined1 (*) [16])
                     (opt_b._0_8_ + local_478 * (long)opt_b.workspace_allocator * uVar22 + 0x30);
          for (pauVar19 = (undefined1 (*) [16])0x0; pauVar19 != pauVar21;
              pauVar19 = (undefined1 (*) [16])(*pauVar19 + 1)) {
            pauVar57 = (undefined1 (*) [16])((long)((iVar68 * (int)pauVar19) / 6) * 0x10 + (long)d1)
            ;
            pauVar93 = pauVar39;
            for (uVar64 = 0; pauVar23 = pauVar57, lVar26 = -0x50, uVar64 != uVar20;
                uVar64 = uVar64 + 1) {
              for (; lVar26 != 0; lVar26 = lVar26 + 0x10) {
                auVar102 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar70 * 4),
                                      *(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 4) * 4));
                auVar126 = vpsubd_avx(*(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 4) * 4),
                                      *(undefined1 (*) [16])(*pauVar23 + lVar70 * 4));
                auVar125 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar50 * 4),
                                      *(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4));
                auVar103 = vpsubd_avx(*(undefined1 (*) [16])
                                       (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4),
                                      *(undefined1 (*) [16])(*pauVar23 + lVar50 * 4));
                auVar101 = vpaddd_avx(auVar102,*pauVar23);
                auVar101 = vpaddd_avx(auVar101,auVar125);
                auVar140 = vpaddd_avx(auVar103,auVar103);
                auVar140 = vpaddd_avx(auVar140,auVar126);
                auVar125 = vpslld_avx(auVar125,2);
                auVar102 = vpaddd_avx(auVar125,auVar102);
                auVar125 = vpslld_avx512vl(*(undefined1 (*) [16])
                                            (*pauVar23 + (long)(int)(uVar54 * 0x14) * 4),2);
                auVar125 = vpaddd_avx(auVar125,auVar126);
                auVar126 = vpslld_avx(auVar103,3);
                auVar125 = vpaddd_avx(auVar125,auVar126);
                *(undefined1 (*) [16])(local_388 + lVar26) = auVar101;
                *(undefined1 (*) [16])(local_328 + lVar26) = auVar140;
                *(undefined1 (*) [16])(local_2c8 + lVar26) = auVar102;
                *(undefined1 (*) [16])(local_268 + lVar26) = auVar125;
                pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 0x18) * 4);
              }
              auVar125 = vpslld_avx512vl(*(undefined1 (*) [16])
                                          (*pauVar23 + (long)(int)(uVar54 * 0x14) * 4),4);
              auVar102 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 4) * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + lVar70 * 4));
              auVar126 = vpslld_avx(auVar102,2);
              auVar102 = vpaddd_avx(auVar126,auVar125);
              auVar101 = vpsubd_avx(*(undefined1 (*) [16])
                                     (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + lVar50 * 4));
              auVar125 = vpslld_avx(auVar101,5);
              local_268 = vpaddd_avx(auVar125,auVar102);
              auVar102 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar50 * 4),
                                    *(undefined1 (*) [16])
                                     (*pauVar23 + (long)(int)(uVar54 * 0xc) * 4));
              auVar103 = vpslld_avx(auVar102,4);
              auVar125 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar23 + lVar70 * 4),
                                    *(undefined1 (*) [16])(*pauVar23 + (long)(int)(uVar54 * 4) * 4))
              ;
              auVar140 = vpslld_avx(auVar125,2);
              local_2c8 = vpaddd_avx(auVar103,auVar140);
              auVar101 = vpslld_avx(auVar101,3);
              local_328 = vpaddd_avx(auVar101,auVar126);
              auVar125 = vpaddd_avx(auVar125,*pauVar23);
              auVar102 = vpaddd_avx(auVar125,auVar102);
              local_388 = vpslld_avx(auVar102,2);
              pauVar23 = pauVar93;
              for (lVar26 = 0x50; lVar26 != 0x1d0; lVar26 = lVar26 + 0x60) {
                auVar102 = vpaddd_avx(*(undefined1 (*) [16])((long)local_408 + lVar26),
                                      *(undefined1 (*) [16])(auStack_418 + lVar26));
                auVar126 = vpsubd_avx(*(undefined1 (*) [16])(auStack_418 + lVar26),
                                      *(undefined1 (*) [16])((long)local_408 + lVar26));
                auVar125 = vpaddd_avx(*(undefined1 (*) [16])((long)aiStack_3e8 + lVar26),
                                      *(undefined1 (*) [16])((long)local_3f8 + lVar26));
                auVar101 = vpaddd_avx(auVar102,*(undefined1 (*) [16])((long)w2 + lVar26));
                auVar103 = vpsubd_avx(*(undefined1 (*) [16])((long)local_3f8 + lVar26),
                                      *(undefined1 (*) [16])((long)aiStack_3e8 + lVar26));
                auVar101 = vpaddd_avx(auVar101,auVar125);
                auVar140 = vpaddd_avx(auVar103,auVar103);
                auVar140 = vpaddd_avx(auVar140,auVar126);
                auVar125 = vpslld_avx(auVar125,2);
                auVar125 = vpaddd_avx(auVar125,auVar102);
                auVar102 = vpaddd_avx(auVar126,*(undefined1 (*) [16])(&opt_q.lightmode + lVar26));
                auVar126 = vpslld_avx(auVar103,3);
                auVar126 = vpaddd_avx(auVar102,auVar126);
                auVar102 = vcvtdq2ps_avx(auVar101);
                auVar141._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar141._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar141._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar141._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar140);
                auVar139._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar139._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar139._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar139._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar125);
                auVar136._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar136._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar136._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar136._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                auVar102 = vcvtdq2ps_avx(auVar126);
                auVar100._0_4_ = (int)(auVar102._0_4_ * 0.0017361111);
                auVar100._4_4_ = (int)(auVar102._4_4_ * 0.0017361111);
                auVar100._8_4_ = (int)(auVar102._8_4_ * 0.0017361111);
                auVar100._12_4_ = (int)(auVar102._12_4_ * 0.0017361111);
                pauVar23[-3] = auVar141;
                pauVar23[-2] = auVar139;
                pauVar23[-1] = auVar136;
                *pauVar23 = auVar100;
                pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(int)(local_630._0_4_ << 4) * 4);
              }
              pauVar57 = pauVar57 + 1;
              pauVar93 = pauVar93 + 4;
            }
            pauVar39 = (undefined1 (*) [16])
                       (*pauVar39 + (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4);
          }
        }
        copy_cut_border((Mat *)&opt_b,&local_628,0,opt_b.flush_denormals - local_628.h,0,
                        opt_b._44_4_ - local_628.w,opt);
        if (opt_b.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)opt_b.blob_allocator = *(int *)opt_b.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_b.blob_allocator == 0) {
            if (opt_b._32_8_ == 0) {
              free((void *)opt_b._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
            }
          }
        }
        if (piStack_500 != (int *)0x0) {
          LOCK();
          *piStack_500 = *piStack_500 + -1;
          UNLOCK();
          if (*piStack_500 == 0) {
            if (pAStack_4e8 == (Allocator *)0x0) {
              free((void *)d1);
            }
            else {
              (**(code **)(*(long *)pAStack_4e8 + 0x18))();
            }
          }
        }
        piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
        if (piVar61 != (int *)0x0) {
          LOCK();
          *piVar61 = *piVar61 + -1;
          UNLOCK();
          if (*piVar61 == 0) {
            pvVar33 = local_588.data;
            if (local_588.allocator == (Allocator *)0x0) {
LAB_001cd76e:
              free(pvVar33);
            }
            else {
              (**(code **)(*(long *)local_588.allocator + 0x18))();
            }
          }
        }
      }
      else {
        uVar89 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
        uVar45 = (ulong)uVar89;
        iVar68 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
        pauVar39 = (undefined1 (*) [16])(long)iVar68;
        iVar17 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
        iVar92 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
        iVar42 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
        local_6d8._0_4_ = local_698.w;
        lVar50 = (long)local_628.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar89 * uVar28,local_698.c,8,8,
                      opt->workspace_allocator);
          iVar68 = iVar92 * uVar54;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar96 < 1) {
            uVar96 = 0;
          }
          if ((int)uVar28 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar89 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar55 < 1) {
            uVar55 = 0;
          }
          for (uVar22 = 0; uVar22 != uVar55; uVar22 = uVar22 + 1) {
            pvVar33 = (void *)(local_698.cstep * uVar22 * local_698.elemsize + (long)local_698.data)
            ;
            local_6d8 = pvVar33;
            puVar37 = (undefined8 *)opt_q._0_8_;
            for (uVar64 = 0; uVar64 != uVar45; uVar64 = uVar64 + 1) {
              for (uVar90 = 0; uVar90 != uVar20; uVar90 = uVar90 + 1) {
                puVar56 = (undefined8 *)
                          ((long)pvVar33 +
                          uVar90 * (long)pauVar39 * 8 +
                          local_698.elemsize * (long)local_698.w * (long)iVar17 * uVar64);
                for (uVar28 = 0; uVar89 = uVar54, uVar28 != uVar96; uVar28 = uVar28 + 1) {
                  while (uVar89 != 0) {
                    *puVar37 = *puVar56;
                    puVar37 = puVar37 + 1;
                    puVar56 = puVar56 + iVar92;
                    uVar89 = uVar89 - 1;
                  }
                  puVar56 = puVar56 + ((long)(iVar83 * iVar42) - (long)iVar68);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
            UNLOCK();
            if (*(int *)opt_q.blob_allocator == 0) {
              pvVar33 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001cd76e;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar88 = uVar89 * uVar28;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar88,
                     (allocator_type *)&local_588);
          local_6d8._0_4_ = iVar83 * iVar17 - iVar68 * uVar28;
          uVar24 = 0;
          if ((int)uVar28 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar89 < 1) {
            uVar89 = 0;
          }
          iVar83 = 0;
          uVar45 = uVar20;
          iVar17 = 0;
          for (; uVar24 != uVar89; uVar24 = uVar24 + 1) {
            for (lVar70 = (long)iVar17; (int)uVar45 != lVar70; lVar70 = lVar70 + 1) {
              *(int *)(opt_q._0_8_ + lVar70 * 4) = iVar83;
              iVar83 = iVar83 + iVar68;
            }
            iVar83 = iVar83 + (int)local_6d8;
            uVar45 = (ulong)(uint)((int)uVar45 + (int)uVar20);
            iVar17 = iVar17 + (int)uVar20;
          }
          uVar45 = 0;
          uVar20 = (ulong)uVar88;
          if ((int)uVar88 < 1) {
            uVar20 = uVar45;
          }
          uVar22 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar22 = uVar45;
          }
          uVar64 = 0;
          if (0 < (int)uVar54) {
            uVar64 = (ulong)uVar54;
          }
          uVar90 = (ulong)uVar96;
          if ((int)uVar96 < 1) {
            uVar90 = uVar45;
          }
          uVar30 = (ulong)(uint)iVar87;
          if (iVar87 < 1) {
            uVar30 = uVar45;
          }
          for (; uVar45 != uVar30; uVar45 = uVar45 + 1) {
            local_6d8 = (void *)(local_628.cstep * uVar45 * local_628.elemsize +
                                (long)local_628.data);
            for (uVar71 = 0; uVar71 != uVar90; uVar71 = uVar71 + 1) {
              for (uVar63 = 0; uVar63 != uVar64; uVar63 = uVar63 + 1) {
                pvVar33 = (void *)((this->weight_data_tm).cstep * uVar45 *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
                auVar119 = ZEXT1664((undefined1  [16])0x0);
                auVar132 = ZEXT1664((undefined1  [16])0x0);
                auVar134 = ZEXT1664((undefined1  [16])0x0);
                auVar137 = ZEXT1664((undefined1  [16])0x0);
                for (uVar32 = 0; uVar32 != uVar22; uVar32 = uVar32 + 1) {
                  pauVar39 = (undefined1 (*) [16])
                             ((long)local_698.data +
                             local_698.cstep * local_698.elemsize * uVar32 +
                             (long)(iVar92 * 8 * (int)uVar63) +
                             (long)local_698.w * uVar71 * (long)iVar42 * local_698.elemsize);
                  for (lVar70 = 0; uVar20 * 4 != lVar70; lVar70 = lVar70 + 4) {
                    auVar125._8_8_ = 0;
                    auVar125._0_8_ =
                         *(ulong *)(*pauVar39 + (long)*(int *)(opt_q._0_8_ + lVar70) * 8);
                    auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar125);
                    auVar136 = vpunpcklbw_avx(auVar125,auVar102);
                    auVar102 = *(undefined1 (*) [16])((long)pvVar33 + lVar70 * 8);
                    auVar125 = *(undefined1 (*) [16])((long)pvVar33 + lVar70 * 8 + 0x10);
                    auVar101 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                    auVar140 = vpcmpgtb_avx((undefined1  [16])0x0,auVar125);
                    auVar126 = vpunpcklbw_avx(auVar102,auVar101);
                    auVar102 = vpunpckhbw_avx(auVar102,auVar101);
                    auVar101 = vpunpcklbw_avx(auVar125,auVar140);
                    auVar125 = vpunpckhbw_avx(auVar125,auVar140);
                    auVar141 = vpmullw_avx(auVar126,auVar136);
                    auVar126 = vpmulhw_avx(auVar126,auVar136);
                    auVar139 = vpmullw_avx(auVar136,auVar102);
                    auVar103 = vpmulhw_avx(auVar136,auVar102);
                    auVar104 = vpmullw_avx(auVar101,auVar136);
                    auVar100 = vpmulhw_avx(auVar101,auVar136);
                    auVar123 = vpmullw_avx(auVar136,auVar125);
                    auVar136 = vpmulhw_avx(auVar136,auVar125);
                    auVar102 = vpunpcklwd_avx(auVar141,auVar126);
                    auVar102 = vpaddd_avx(auVar137._0_16_,auVar102);
                    auVar125 = vpunpcklwd_avx(auVar139,auVar103);
                    auVar125 = vpaddd_avx(auVar134._0_16_,auVar125);
                    auVar101 = vpunpcklwd_avx(auVar104,auVar100);
                    auVar101 = vpaddd_avx(auVar132._0_16_,auVar101);
                    auVar140 = vpunpcklwd_avx(auVar123,auVar136);
                    auVar140 = vpaddd_avx(auVar119._0_16_,auVar140);
                    auVar126 = vpunpckhwd_avx(auVar141,auVar126);
                    auVar102 = vpaddd_avx(auVar102,auVar126);
                    auVar137 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar139,auVar103);
                    auVar102 = vpaddd_avx(auVar125,auVar102);
                    auVar134 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar104,auVar100);
                    auVar102 = vpaddd_avx(auVar101,auVar102);
                    auVar132 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar123,auVar136);
                    auVar102 = vpaddd_avx(auVar140,auVar102);
                    auVar119 = ZEXT1664(auVar102);
                  }
                  pvVar33 = (void *)((long)pvVar33 + uVar20 * 0x20);
                }
                auVar102 = vpunpckldq_avx(auVar137._0_16_,auVar134._0_16_);
                auVar140 = vpunpckldq_avx(auVar132._0_16_,auVar119._0_16_);
                auVar125 = vpunpckhdq_avx(auVar137._0_16_,auVar134._0_16_);
                auVar101 = vpunpckhdq_avx(auVar132._0_16_,auVar119._0_16_);
                auVar126 = vpunpcklqdq_avx(auVar102,auVar140);
                auVar102 = vpunpckhqdq_avx(auVar102,auVar140);
                auVar102 = vpaddd_avx(auVar126,auVar102);
                auVar140 = vpunpcklqdq_avx(auVar125,auVar101);
                auVar125 = vpunpckhqdq_avx(auVar125,auVar101);
                auVar125 = vpaddd_avx(auVar125,auVar140);
                auVar102 = vpaddd_avx(auVar102,auVar125);
                *(undefined1 (*) [16])((long)local_6d8 + uVar63 * 0x10) = auVar102;
              }
              local_6d8 = (void *)((long)local_6d8 + lVar50 * 0x10);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
      }
LAB_001c901b:
      iVar87 = local_628.c;
      uVar55 = local_628.h;
      iVar83 = local_628.w;
      iVar17 = local_698.c;
      iVar68 = local_698.w;
      if ((iVar44 == 1) && (local_640._0_4_ == 4)) {
        p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
        uVar54 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar129 = opt_q._60_4_;
        if (uVar54 == 7) {
          if ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))))
          goto LAB_001c9857;
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,0x31,local_698.c,1,1,
                      opt->workspace_allocator);
          pauVar21 = (undefined1 (*) [16])0x0;
          pauVar19 = (undefined1 (*) [16])(ulong)uVar55;
          if ((int)uVar55 < 1) {
            pauVar19 = pauVar21;
          }
          pauVar39 = (undefined1 (*) [16])(ulong)(uint)iVar17;
          if (iVar17 < 1) {
            pauVar39 = pauVar21;
          }
          for (; pauVar21 != pauVar39; pauVar21 = (undefined1 (*) [16])(*pauVar21 + 1)) {
            lVar50 = opt_q._0_8_;
            for (lVar70 = 0; lVar70 != 7; lVar70 = lVar70 + 1) {
              for (lVar26 = 0; lVar26 != 7; lVar26 = lVar26 + 1) {
                puVar31 = (undefined1 *)
                          ((long)local_698.data +
                          lVar26 + (long)local_698.w * local_698.elemsize * lVar70 +
                                   local_698.cstep * (long)pauVar21 * local_698.elemsize);
                for (iVar17 = 0; iVar17 != (int)pauVar19; iVar17 = iVar17 + 1) {
                  puVar62 = puVar31 + (iVar68 - iVar83) * 2;
                  puVar78 = puVar31;
                  for (lVar46 = 0; (int)lVar46 + 3 < iVar83; lVar46 = lVar46 + 4) {
                    *(undefined1 *)(lVar50 + lVar46) = *puVar78;
                    *(undefined1 *)(lVar50 + 1 + lVar46) = puVar78[2];
                    *(undefined1 *)(lVar50 + 2 + lVar46) = puVar78[4];
                    *(undefined1 *)(lVar50 + 3 + lVar46) = puVar78[6];
                    puVar78 = puVar78 + 8;
                    puVar62 = puVar62 + 8;
                  }
                  for (; (int)lVar46 + 1 < iVar83; lVar46 = lVar46 + 2) {
                    *(undefined1 *)(lVar50 + lVar46) = *puVar78;
                    *(undefined1 *)(lVar50 + 1 + lVar46) = puVar78[2];
                    puVar78 = puVar78 + 4;
                    puVar62 = puVar62 + 4;
                  }
                  for (; (int)lVar46 < iVar83; lVar46 = lVar46 + 1) {
                    *(undefined1 *)(lVar50 + lVar46) = puVar31[lVar46 * 2];
                    puVar62 = puVar62 + 2;
                  }
                  lVar50 = lVar50 + lVar46;
                  puVar31 = puVar62;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
            UNLOCK();
            if (*(int *)opt_q.blob_allocator == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001cba91;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar54 == 3) {
          if (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3)
          goto LAB_001c9857;
          if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)))) {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_001c9857;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.h * local_628.w,9,local_698.c,1,1,
                        opt->workspace_allocator);
            pauVar21 = (undefined1 (*) [16])0x0;
            pauVar19 = (undefined1 (*) [16])(ulong)uVar55;
            if ((int)uVar55 < 1) {
              pauVar19 = pauVar21;
            }
            pauVar39 = (undefined1 (*) [16])(ulong)(uint)iVar17;
            if (iVar17 < 1) {
              pauVar39 = pauVar21;
            }
            for (; pauVar21 != pauVar39; pauVar21 = (undefined1 (*) [16])(*pauVar21 + 1)) {
              lVar50 = opt_q._0_8_;
              for (lVar70 = 0; lVar70 != 3; lVar70 = lVar70 + 1) {
                for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
                  puVar31 = (undefined1 *)
                            ((long)local_698.data +
                            lVar26 + (long)local_698.w * local_698.elemsize * lVar70 +
                                     local_698.cstep * (long)pauVar21 * local_698.elemsize);
                  for (iVar17 = 0; iVar17 != (int)pauVar19; iVar17 = iVar17 + 1) {
                    puVar62 = puVar31 + (iVar68 - iVar83) * 2;
                    puVar78 = puVar31;
                    for (lVar46 = 0; (int)lVar46 + 3 < iVar83; lVar46 = lVar46 + 4) {
                      *(undefined1 *)(lVar50 + lVar46) = *puVar78;
                      *(undefined1 *)(lVar50 + 1 + lVar46) = puVar78[2];
                      *(undefined1 *)(lVar50 + 2 + lVar46) = puVar78[4];
                      *(undefined1 *)(lVar50 + 3 + lVar46) = puVar78[6];
                      puVar78 = puVar78 + 8;
                      puVar62 = puVar62 + 8;
                    }
                    for (; (int)lVar46 + 1 < iVar83; lVar46 = lVar46 + 2) {
                      *(undefined1 *)(lVar50 + lVar46) = *puVar78;
                      *(undefined1 *)(lVar50 + 1 + lVar46) = puVar78[2];
                      puVar78 = puVar78 + 4;
                      puVar62 = puVar62 + 4;
                    }
                    for (; (int)lVar46 < iVar83; lVar46 = lVar46 + 1) {
                      *(undefined1 *)(lVar50 + lVar46) = puVar31[lVar46 * 2];
                      puVar62 = puVar62 + 2;
                    }
                    lVar50 = lVar50 + lVar46;
                    puVar31 = puVar62;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_q.blob_allocator == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001cba91;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_001c9d85;
          }
          opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
          opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
          opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
          Mat::create((Mat *)&opt_q,local_628.h * local_628.w,9,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar45 = 0;
          uVar20 = (ulong)uVar55;
          if ((int)uVar55 < 1) {
            uVar20 = uVar45;
          }
          uVar22 = (ulong)(uint)iVar17;
          if (iVar17 < 1) {
            uVar22 = uVar45;
          }
          for (; pauVar39 = (undefined1 (*) [16])0x0, uVar45 != uVar22; uVar45 = uVar45 + 1) {
            lVar50 = opt_q._0_8_;
            for (lVar70 = 0; lVar70 != 3; lVar70 = lVar70 + 1) {
              for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
                lVar46 = (long)local_698.data +
                         lVar26 + (long)local_698.w * local_698.elemsize * lVar70 +
                                  local_698.cstep * uVar45 * local_698.elemsize;
                for (iVar17 = 0; iVar17 != (int)uVar20; iVar17 = iVar17 + 1) {
                  for (lVar72 = 0; (int)lVar72 + 3 < iVar83; lVar72 = lVar72 + 4) {
                    *(undefined1 *)(lVar50 + lVar72) = *(undefined1 *)(lVar46 + lVar72);
                    *(undefined1 *)(lVar50 + 1 + lVar72) = *(undefined1 *)(lVar46 + 1 + lVar72);
                    *(undefined1 *)(lVar50 + 2 + lVar72) = *(undefined1 *)(lVar46 + 2 + lVar72);
                    *(undefined1 *)(lVar50 + 3 + lVar72) = *(undefined1 *)(lVar46 + 3 + lVar72);
                  }
                  for (; (int)lVar72 + 1 < iVar83; lVar72 = lVar72 + 2) {
                    *(undefined1 *)(lVar50 + lVar72) = *(undefined1 *)(lVar46 + lVar72);
                    *(undefined1 *)(lVar50 + 1 + lVar72) = *(undefined1 *)(lVar46 + 1 + lVar72);
                  }
                  for (; (int)lVar72 < iVar83; lVar72 = lVar72 + 1) {
                    *(undefined1 *)(lVar50 + lVar72) = *(undefined1 *)(lVar46 + lVar72);
                  }
                  lVar46 = lVar46 + (iVar68 - iVar83) + lVar72;
                  lVar50 = lVar50 + lVar72;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
          if (opt_q.blob_allocator == (Allocator *)0x0) goto LAB_001c9d85;
          LOCK();
          *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_q.blob_allocator != 0) goto LAB_001c9d85;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_001c9d85;
          }
LAB_001cba91:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar54 == 1) &&
             (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
            if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                ((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
              goto LAB_001cb678;
            }
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 2)) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                          local_698.elempack,opt->workspace_allocator);
              pauVar19 = (undefined1 (*) [16])0x0;
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              pauVar39 = (undefined1 (*) [16])(ulong)(uint)iVar17;
              if (iVar17 < 1) {
                pauVar39 = pauVar19;
              }
              for (; pauVar19 != pauVar39; pauVar19 = (undefined1 (*) [16])(*pauVar19 + 1)) {
                puVar31 = (undefined1 *)
                          (local_698.cstep * (long)pauVar19 * local_698.elemsize +
                          (long)local_698.data);
                lVar50 = opt_q._0_8_;
                for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                  puVar62 = puVar31 + (iVar68 - iVar83) * 2;
                  puVar78 = puVar31;
                  for (lVar70 = 0; (int)lVar70 + 3 < iVar83; lVar70 = lVar70 + 4) {
                    *(undefined1 *)(lVar50 + lVar70) = *puVar78;
                    *(undefined1 *)(lVar50 + 1 + lVar70) = puVar78[2];
                    *(undefined1 *)(lVar50 + 2 + lVar70) = puVar78[4];
                    *(undefined1 *)(lVar50 + 3 + lVar70) = puVar78[6];
                    puVar78 = puVar78 + 8;
                    puVar62 = puVar62 + 8;
                  }
                  for (; (int)lVar70 + 1 < iVar83; lVar70 = lVar70 + 2) {
                    *(undefined1 *)(lVar50 + lVar70) = *puVar78;
                    *(undefined1 *)(lVar50 + 1 + lVar70) = puVar78[2];
                    puVar78 = puVar78 + 4;
                    puVar62 = puVar62 + 4;
                  }
                  for (; (int)lVar70 < iVar83; lVar70 = lVar70 + 1) {
                    *(undefined1 *)(lVar50 + lVar70) = puVar31[lVar70 * 2];
                    puVar62 = puVar62 + 2;
                  }
                  lVar50 = lVar50 + lVar70;
                  puVar31 = puVar62;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
                UNLOCK();
                if (*(int *)opt_q.blob_allocator == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_001cba91;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001c9d85;
            }
          }
LAB_001c9857:
          uVar96 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
          iVar92 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
          iVar42 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
          iVar49 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
          lVar50 = (long)iVar49;
          iVar43 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
          lVar70 = (long)local_628.w;
          uVar28 = uVar96 * uVar54;
          if (opt->use_sgemm_convolution == true) {
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar28,local_698.c,1,1,
                        opt->workspace_allocator);
            pauVar39 = (undefined1 (*) [16])0x0;
            iVar87 = iVar49 * 2;
            pauVar19 = (undefined1 (*) [16])0x0;
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            pauVar21 = (undefined1 (*) [16])(ulong)uVar54;
            if ((int)uVar54 < 1) {
              pauVar21 = pauVar19;
            }
            pauVar93 = (undefined1 (*) [16])(ulong)uVar96;
            if ((int)uVar96 < 1) {
              pauVar93 = pauVar19;
            }
            pauVar57 = (undefined1 (*) [16])(ulong)(uint)iVar17;
            if (iVar17 < 1) {
              pauVar57 = pauVar19;
            }
            for (; pauVar19 != pauVar57; pauVar19 = (undefined1 (*) [16])(*pauVar19 + 1)) {
              lVar70 = opt_q._0_8_;
              for (pauVar23 = (undefined1 (*) [16])0x0; pauVar23 != pauVar93;
                  pauVar23 = (undefined1 (*) [16])(*pauVar23 + 1)) {
                for (pauVar18 = (undefined1 (*) [16])0x0; pauVar18 != pauVar21;
                    pauVar18 = (undefined1 (*) [16])(*pauVar18 + 1)) {
                  puVar31 = (undefined1 *)
                            ((long)local_698.data +
                            (long)pauVar18 * (long)iVar92 +
                            (long)local_698.w * local_698.elemsize * (long)iVar42 * (long)pauVar23 +
                            local_698.cstep * (long)pauVar19 * local_698.elemsize);
                  for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                    pauVar39 = (undefined1 (*) [16])0x0;
                    puVar62 = puVar31;
                    for (lVar26 = 0; (int)lVar26 + 3 < iVar83; lVar26 = lVar26 + 4) {
                      *(undefined1 *)(lVar70 + lVar26) = *puVar62;
                      *(undefined1 *)(lVar70 + 1 + lVar26) = puVar62[lVar50];
                      *(undefined1 *)(lVar70 + 2 + lVar26) = puVar62[iVar87];
                      *(undefined1 *)(lVar70 + 3 + lVar26) = puVar62[iVar49 * 3];
                      puVar62 = puVar62 + iVar49 * 4;
                      pauVar39 = (undefined1 (*) [16])(*pauVar39 + iVar49 * 4);
                    }
                    for (; (int)lVar26 + 1 < iVar83; lVar26 = lVar26 + 2) {
                      *(undefined1 *)(lVar70 + lVar26) = *puVar62;
                      *(undefined1 *)(lVar70 + 1 + lVar26) = puVar62[lVar50];
                      puVar62 = puVar62 + iVar87;
                      pauVar39 = (undefined1 (*) [16])(*pauVar39 + iVar87);
                    }
                    for (; (int)lVar26 < iVar83; lVar26 = lVar26 + 1) {
                      *(undefined1 *)(lVar70 + lVar26) = puVar31[(long)pauVar39];
                      pauVar39 = (undefined1 (*) [16])(*pauVar39 + lVar50);
                    }
                    puVar31 = puVar31 + (iVar68 * iVar43 - iVar83 * iVar49) + (long)pauVar39;
                    lVar70 = lVar70 + lVar26;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_q.blob_allocator == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001cba91;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar20 = (ulong)(uint)local_628.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar28,
                       (allocator_type *)&local_588);
            local_6d8._0_4_ = iVar68 * iVar42 - iVar92 * uVar54;
            uVar89 = 0;
            pauVar39 = (undefined1 (*) [16])(ulong)uVar54;
            if ((int)uVar54 < 1) {
              pauVar39 = (undefined1 (*) [16])0x0;
            }
            if ((int)uVar96 < 1) {
              uVar96 = 0;
            }
            iVar42 = 0;
            pauVar19 = pauVar39;
            iVar68 = 0;
            for (; uVar89 != uVar96; uVar89 = uVar89 + 1) {
              for (lVar26 = (long)iVar68; (int)pauVar19 != lVar26; lVar26 = lVar26 + 1) {
                *(int *)(opt_q._0_8_ + lVar26 * 4) = iVar42;
                iVar42 = iVar42 + iVar92;
              }
              iVar42 = iVar42 + (int)local_6d8;
              pauVar19 = (undefined1 (*) [16])(ulong)(uint)((int)pauVar19 + (int)pauVar39);
              iVar68 = iVar68 + (int)pauVar39;
            }
            uVar22 = 0;
            uVar45 = (ulong)uVar28;
            if ((int)uVar28 < 1) {
              uVar45 = uVar22;
            }
            uVar64 = (ulong)(uint)iVar17;
            if (iVar17 < 1) {
              uVar64 = uVar22;
            }
            uVar90 = 0;
            if (0 < iVar83) {
              uVar90 = (ulong)(uint)iVar83;
            }
            uVar30 = (ulong)uVar55;
            if ((int)uVar55 < 1) {
              uVar30 = uVar22;
            }
            if (iVar87 < 1) {
              uVar20 = uVar22;
            }
            for (; uVar22 != uVar20; uVar22 = uVar22 + 1) {
              local_6d8 = (void *)(local_628.cstep * uVar22 * local_628.elemsize +
                                  (long)local_628.data);
              for (uVar71 = 0; uVar71 != uVar30; uVar71 = uVar71 + 1) {
                for (uVar63 = 0; uVar63 != uVar90; uVar63 = uVar63 + 1) {
                  pvVar33 = (void *)((this->weight_data_tm).cstep * uVar22 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar32 = 0; uVar32 != uVar64; uVar32 = uVar32 + 1) {
                    pauVar39 = (undefined1 (*) [16])
                               ((long)local_698.data +
                               local_698.cstep * local_698.elemsize * uVar32 +
                               uVar63 * lVar50 +
                               (long)local_698.w * uVar71 * (long)iVar43 * local_698.elemsize);
                    for (uVar79 = 0; uVar45 != uVar79; uVar79 = uVar79 + 1) {
                      auVar101 = vpbroadcastw_avx512vl();
                      auVar104._8_8_ = 0;
                      auVar104._0_8_ = *(ulong *)((long)pvVar33 + uVar79 * 4);
                      auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar104);
                      auVar102 = vpunpcklbw_avx(auVar104,auVar102);
                      auVar125 = vpmullw_avx(auVar101,auVar102);
                      auVar102 = vpmulhw_avx(auVar101,auVar102);
                      auVar102 = vpunpcklwd_avx(auVar125,auVar102);
                      auVar102 = vpaddd_avx(auVar119._0_16_,auVar102);
                      auVar119 = ZEXT1664(auVar102);
                    }
                    pvVar33 = (void *)((long)pvVar33 + uVar45 * 4);
                  }
                  *(undefined1 (*) [16])((long)local_6d8 + uVar63 * 0x10) = auVar119._0_16_;
                }
                local_6d8 = (void *)((long)local_6d8 + lVar70 * 0x10);
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_001c9d85:
      iVar87 = local_628.c;
      uVar55 = local_628.h;
      iVar83 = local_628.w;
      sVar81 = local_698.cstep;
      uVar54 = local_698.c;
      iVar17 = local_698.w;
      iVar68 = local_698.elempack;
      uVar96 = local_628.c >> 2;
      uVar129 = opt_q._60_4_;
      if ((iVar44 == 8) && (local_640._0_4_ == 1)) {
        p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
        uVar28 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar20 = (ulong)uVar28;
        if ((uVar28 == 1) &&
           (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_001ca00d;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar45 = 0;
            uVar20 = (ulong)(uint)iVar83;
            if (iVar83 < 1) {
              uVar20 = uVar45;
            }
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            uVar22 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar22 = uVar45;
            }
            for (; uVar45 != uVar22; uVar45 = uVar45 + 1) {
              puVar56 = (undefined8 *)
                        (local_698.cstep * uVar45 * local_698.elemsize + (long)local_698.data);
              puVar37 = (undefined8 *)opt_q._0_8_;
              for (uVar54 = 0; uVar64 = uVar20, uVar54 != uVar55; uVar54 = uVar54 + 1) {
                while (iVar68 = (int)uVar64, uVar64 = (ulong)(iVar68 - 1), iVar68 != 0) {
                  *puVar37 = *puVar56;
                  puVar56 = puVar56 + 2;
                  puVar37 = puVar37 + 1;
                }
                puVar56 = puVar56 + (iVar17 - iVar83) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt)
            ;
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_q.blob_allocator == 0) {
                pvVar33 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001cea88;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001ca00d:
          if (((opt->use_winograd_convolution == true) && (uVar28 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
                 (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
                (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))))))) {
            auVar120._4_4_ = local_628.h;
            auVar120._0_4_ = local_628.w;
            uVar20 = (ulong)local_628.c;
            piVar61 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
            local_588.data = local_698.data;
            local_588.refcount._0_4_ = local_698.refcount._0_4_;
            local_588.refcount._4_4_ = local_698.refcount._4_4_;
            local_588.elemsize = local_698.elemsize;
            local_588.elempack = local_698.elempack;
            local_588.allocator = local_698.allocator;
            local_588.d = local_698.d;
            local_588.h = local_698.h;
            local_588.dims = local_698.dims;
            local_588.w = local_698.w;
            local_588.c = local_698.c;
            local_588.cstep = local_698.cstep;
            if (piVar61 != (int *)0x0) {
              LOCK();
              *piVar61 = *piVar61 + 1;
              UNLOCK();
            }
            auVar10._8_4_ = 3;
            auVar10._0_8_ = 0x300000003;
            auVar10._12_4_ = 3;
            auVar120._8_8_ = 0;
            auVar102 = vpaddd_avx512vl(auVar120,auVar10);
            auVar125 = vpsrad_avx(auVar102,0x1f);
            auVar125 = vpsrld_avx(auVar125,0x1e);
            auVar102 = vpaddd_avx(auVar102,auVar125);
            auVar11._8_4_ = 0xfffffffc;
            auVar11._0_8_ = 0xfffffffcfffffffc;
            auVar11._12_4_ = 0xfffffffc;
            auVar125 = vpandd_avx512vl(auVar102,auVar11);
            iVar83 = auVar125._0_4_ + 2;
            copy_make_border(&local_698,&local_588,0,(auVar125._4_4_ + 2) - local_698.h,0,
                             iVar83 - local_698.w,0,0.0,opt);
            auVar102 = vpsrad_avx512vl(auVar102,2);
            uVar28 = auVar102._0_4_;
            asVar84._0_4_ = auVar102._4_4_;
            local_640._0_4_ = uVar28 * 6;
            iVar17 = uVar28 * 6 * asVar84._0_4_;
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            uVar55 = (uint)((long)iVar17 / 6);
            local_650 = (short  [4])CONCAT44((int)((ulong)pauVar39 >> 0x20),auVar125._0_4_);
            local_648 = (void *)(ulong)auVar125._4_4_;
            Mat::create((Mat *)d0,uVar55,0x24,uVar54,(ulong)(uint)(iVar68 * 2),iVar68,
                        opt->workspace_allocator);
            iVar44 = local_698.c;
            asVar29[0] = 0;
            asVar29[1] = 0;
            asVar29[2] = 0;
            asVar29[3] = 0;
            asVar97[2] = 0;
            asVar97[3] = 0;
            asVar97[0] = (short)uVar28;
            asVar97[1] = (short)(uVar28 >> 0x10);
            if ((int)uVar28 < 1) {
              asVar97 = asVar29;
            }
            asVar84[2] = 0;
            asVar84[3] = 0;
            local_638 = asVar84;
            if ((int)asVar84._0_4_ < 1) {
              local_638 = asVar29;
            }
            asVar95[0] = 0;
            asVar95[1] = 0;
            asVar95[2] = 0;
            asVar95[3] = 0;
            if (0 < (int)uVar54) {
              asVar95[2] = 0;
              asVar95[3] = 0;
              local_698.c._0_2_ = (undefined2)uVar54;
              local_698.c._2_2_ = SUB42(uVar54,2);
              asVar95[0] = (undefined2)local_698.c;
              asVar95[1] = local_698.c._2_2_;
            }
            auVar121._8_2_ = 0xfffb;
            auVar121._0_8_ = 0xfffbfffbfffbfffb;
            auVar121._10_2_ = 0xfffb;
            auVar121._12_2_ = 0xfffb;
            auVar121._14_2_ = 0xfffb;
            while( true ) {
              if (asVar29 == asVar95) break;
              pauVar39 = (undefined1 (*) [16])
                         ((long)local_588.data +
                         local_588.cstep * local_588.elemsize * (long)asVar29 + 0x20);
              asVar25[0] = 0;
              asVar25[1] = 0;
              asVar25[2] = 0;
              asVar25[3] = 0;
              for (; asVar25 != local_638; asVar25 = (short  [4])((long)asVar25 + 1)) {
                pauVar21 = (undefined1 (*) [16])
                           ((long)((local_640._0_4_ * asVar25._0_4_) / 6) * 0x10 + (long)d0);
                asVar94[0] = 0;
                asVar94[1] = 0;
                asVar94[2] = 0;
                asVar94[3] = 0;
                pauVar19 = pauVar39;
                for (; asVar94 != asVar97; asVar94 = (short  [4])((long)asVar94 + 1)) {
                  pauVar93 = pauVar19;
                  for (lVar50 = -0x60; pauVar57 = pauVar21, lVar70 = 0x50, lVar50 != 0;
                      lVar50 = lVar50 + 0x10) {
                    auVar102 = pauVar93[-2];
                    auVar101 = pauVar93[-1];
                    auVar140 = *pauVar93;
                    auVar126 = vpcmpgtb_avx((undefined1  [16])0x0,auVar102);
                    auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar101);
                    auVar100 = vpcmpgtb_avx((undefined1  [16])0x0,auVar140);
                    auVar136 = vpunpcklbw_avx(auVar102,auVar126);
                    auVar141 = vpunpckhbw_avx(auVar102,auVar126);
                    auVar126 = vpunpcklbw_avx(auVar101,auVar103);
                    auVar103 = vpunpckhbw_avx(auVar101,auVar103);
                    auVar104 = vpunpcklbw_avx(auVar140,auVar100);
                    auVar139 = vpunpckhbw_avx(auVar140,auVar100);
                    auVar102 = vpsllw_avx(auVar136,2);
                    auVar102 = vpaddw_avx(auVar102,auVar104);
                    auVar101 = vpmullw_avx(auVar126,auVar121);
                    auVar102 = vpaddw_avx(auVar102,auVar101);
                    auVar101 = vpaddw_avx(auVar104,auVar103);
                    auVar140 = vpaddw_avx(auVar126,auVar141);
                    auVar140 = vpsllw_avx(auVar140,2);
                    auVar100 = vpsubw_avx(auVar101,auVar140);
                    auVar101 = vpsubw_avx(auVar104,auVar103);
                    auVar140 = vpsubw_avx(auVar141,auVar126);
                    auVar140 = vpsllw_avx(auVar140,2);
                    auVar101 = vpaddw_avx(auVar101,auVar140);
                    auVar126 = vpsubw_avx(auVar104,auVar126);
                    auVar140 = vpsubw_avx(auVar141,auVar103);
                    auVar140 = vpaddw_avx(auVar140,auVar140);
                    auVar136 = vpsubw_avx(auVar126,auVar140);
                    auVar140 = vpaddw_avx(auVar126,auVar140);
                    auVar126 = vpsllw_avx(auVar141,2);
                    auVar126 = vpaddw_avx(auVar126,auVar139);
                    auVar103 = vpmullw_avx(auVar103,auVar121);
                    auVar126 = vpaddw_avx(auVar126,auVar103);
                    *(undefined1 (*) [16])(auStack_378 + lVar50) = auVar102;
                    *(undefined1 (*) [16])(auStack_318 + lVar50) = auVar100;
                    *(undefined1 (*) [16])(auStack_2b8 + lVar50) = auVar101;
                    *(undefined1 (*) [16])(auStack_258 + lVar50) = auVar136;
                    *(undefined1 (*) [16])(auStack_1f8 + lVar50) = auVar140;
                    *(undefined1 (*) [16])((long)w1 + lVar50) = auVar126;
                    pauVar93 = (undefined1 (*) [16])(*pauVar93 + iVar83 * 8);
                  }
                  for (; lVar70 != 0x290; lVar70 = lVar70 + 0x60) {
                    auVar102 = *(undefined1 (*) [16])(auStack_418 + lVar70);
                    auVar101 = *(undefined1 (*) [16])((long)local_408 + lVar70);
                    auVar140 = *(undefined1 (*) [16])((long)local_3f8 + lVar70);
                    auVar126 = *(undefined1 (*) [16])((long)aiStack_3e8 + lVar70);
                    auVar103 = vpsllw_avx512vl(*(undefined1 (*) [16])((long)w2 + lVar70),2);
                    auVar100 = vpmullw_avx(auVar101,auVar121);
                    auVar103 = vpaddw_avx(auVar103,auVar126);
                    auVar103 = vpaddw_avx(auVar100,auVar103);
                    auVar100 = vpaddw_avx(auVar126,auVar140);
                    auVar136 = vpaddw_avx(auVar101,auVar102);
                    auVar136 = vpsllw_avx(auVar136,2);
                    auVar136 = vpsubw_avx(auVar100,auVar136);
                    auVar100 = vpsubw_avx(auVar126,auVar140);
                    auVar141 = vpsubw_avx(auVar102,auVar101);
                    auVar141 = vpsllw_avx(auVar141,2);
                    auVar100 = vpaddw_avx(auVar141,auVar100);
                    auVar126 = vpsubw_avx(auVar126,auVar101);
                    auVar101 = vpsubw_avx(auVar102,auVar140);
                    auVar101 = vpaddw_avx(auVar101,auVar101);
                    auVar141 = vpsubw_avx(auVar126,auVar101);
                    auVar101 = vpaddw_avx(auVar126,auVar101);
                    auVar126 = vpsllw_avx(auVar102,2);
                    auVar102 = vpmullw_avx(auVar140,auVar121);
                    auVar102 = vpaddw_avx(auVar102,auVar126);
                    auVar102 = vpaddw_avx(auVar102,*(undefined1 (*) [16])(&opt_q.lightmode + lVar70)
                                         );
                    *pauVar57 = auVar103;
                    *(undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 * 8) * 2) = auVar136;
                    *(undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 << 4) * 2) = auVar100;
                    *(undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 * 0x18) * 2) = auVar141;
                    *(undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 << 5) * 2) = auVar101;
                    *(undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 * 0x28) * 2) = auVar102;
                    pauVar57 = (undefined1 (*) [16])(*pauVar57 + (long)(int)(uVar55 * 0x30) * 2);
                  }
                  pauVar19 = pauVar19 + 2;
                  pauVar21 = pauVar21 + 1;
                }
                pauVar39 = (undefined1 (*) [16])
                           (*pauVar39 + (long)local_588.w * local_588.elemsize * 4);
              }
              asVar29 = (short  [4])((long)asVar29 + 1);
            }
            piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
            local_698.c = iVar44;
            if (piVar61 != (int *)0x0) {
              LOCK();
              *piVar61 = *piVar61 + -1;
              UNLOCK();
              if (*piVar61 == 0) {
                if (local_588.allocator == (Allocator *)0x0) {
                  free(local_588.data);
                }
                else {
                  (**(code **)(*(long *)local_588.allocator + 0x18))();
                }
              }
            }
            auVar16 = (undefined1  [36])opt_q._28_36_;
            auVar12 = auStack_4ec;
            local_588.cstep = 0;
            local_588.data = (void *)0x0;
            local_588.refcount._0_4_ = 0;
            local_588.refcount._4_4_ = 0;
            local_588.elemsize = 0;
            local_588.elempack = 0;
            local_588.h = 0;
            local_588.d = 0;
            local_588.c = 0;
            local_588.allocator = (Allocator *)0x0;
            local_588.dims = 0;
            local_588.w = 0;
            _d1 = SUB1612((undefined1  [16])0x0,0);
            _d1 = ZEXT1228(_d1);
            auStack_4ec._32_4_ = auVar12._32_4_;
            _d1 = ZEXT3260(_d1);
            opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
            opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
            opt_q._60_4_ = auVar16._32_4_;
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            if (iVar17 < 0x18) {
              uVar28 = uVar55;
              if (0xb < iVar17) {
                uVar54 = uVar54 * 2;
                uVar28 = (uVar55 & 1) + 1;
              }
            }
            else {
              uVar54 = uVar54 << 2;
              uVar28 = (uVar55 & 1) + ((uint)((ulong)((long)iVar17 / 6) >> 2) & 0x3fffffff) +
                       (uint)((uVar55 >> 1 & 1) != 0);
            }
            Mat::create((Mat *)&opt_q,uVar54,uVar28,0x24,(ulong)(uint)(iVar68 * 2),iVar68,
                        opt->workspace_allocator);
            lVar70 = (long)(int)uVar55;
            for (lVar50 = 0; lVar50 != 0x24; lVar50 = lVar50 + 1) {
              lVar26 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
              lVar46 = lVar50 * lVar70;
              for (uVar45 = 0; (long)(uVar45 | 3) < lVar70; uVar45 = uVar45 + 4) {
                pauVar58 = (undefined1 (*) [64])((uVar45 >> 2) * lVar26 + opt_q._0_8_);
                asVar51 = asVar95;
                while (iVar68 = asVar51._0_4_, asVar51._0_4_ = iVar68 - 1, asVar51[2] = 0,
                      asVar51[3] = 0, iVar68 != 0) {
                  auVar119 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((uVar45 + lVar46) * 0x10 + (long)d0));
                  auVar119 = vmovdqu64_avx512f(auVar119);
                  *pauVar58 = auVar119;
                  pauVar58 = pauVar58 + 1;
                }
              }
              for (; (long)(uVar45 | 1) < lVar70; uVar45 = uVar45 + 2) {
                pauVar59 = (undefined1 (*) [32])
                           ((ulong)(((uint)(uVar45 >> 2) & 0x3fffffff) +
                                   (uint)(((uint)uVar45 >> 1 & 1) != 0)) * lVar26 + opt_q._0_8_);
                asVar60 = asVar95;
                while (iVar68 = asVar60._0_4_, asVar60._0_4_ = iVar68 - 1, asVar60[2] = 0,
                      asVar60[3] = 0, iVar68 != 0) {
                  *pauVar59 = *(undefined1 (*) [32])((uVar45 + lVar46) * 0x10 + (long)d0);
                  pauVar59 = pauVar59 + 1;
                }
              }
              for (; (long)uVar45 < lVar70; uVar45 = uVar45 + 1) {
                pauVar39 = (undefined1 (*) [16])
                           ((ulong)(((uint)uVar45 & 1) + ((uint)(uVar45 >> 2) & 0x3fffffff) +
                                   (uint)(((uint)uVar45 >> 1 & 1) != 0)) * lVar26 + opt_q._0_8_);
                asVar98 = asVar95;
                while (iVar68 = asVar98._0_4_, asVar98._0_4_ = iVar68 - 1, asVar98[2] = 0,
                      asVar98[3] = 0, iVar68 != 0) {
                  *pauVar39 = *(undefined1 (*) [16])((uVar45 + lVar46) * 0x10 + (long)d0);
                  pauVar39 = pauVar39 + 1;
                }
              }
            }
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            Mat::create((Mat *)d1,uVar55,0x24,iVar87,4,1,opt->workspace_allocator);
            asVar29 = local_638;
            asVar27 = local_650;
            local_6f8 = (this->weight_winograd43_data).data;
            sVar81 = (this->weight_winograd43_data).elemsize;
            uVar45 = (ulong)uVar96;
            if ((int)uVar96 < 1) {
              uVar45 = 0;
            }
            uVar22 = 0;
            local_630 = (short  [4])((this->weight_winograd43_data).cstep * sVar81);
            auVar5 = vpmovsxbw_avx2(_DAT_004bbc00);
            auVar6 = vpmovsxbw_avx2(_DAT_004bbc10);
            auVar7 = vpmovsxbw_avx2(_DAT_004bbc20);
            auVar8 = vpmovsxbw_avx2(_DAT_004bbc30);
            for (; uVar22 != uVar45; uVar22 = uVar22 + 1) {
              iVar68 = (this->weight_winograd43_data).w;
              asVar84 = d1;
              pvVar33 = local_6f8;
              asVar51 = d1;
              asVar60 = d1;
              asVar98 = d1;
              for (lVar50 = 0; lVar50 != 0x24; lVar50 = lVar50 + 1) {
                lVar46 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
                lVar26 = opt_q._0_8_;
                for (uVar64 = 0; (long)(uVar64 | 3) < lVar70; uVar64 = uVar64 + 4) {
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  lVar72 = 0;
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  auVar134 = ZEXT1664((undefined1  [16])0x0);
                  auVar137 = ZEXT1664((undefined1  [16])0x0);
                  asVar47 = asVar95;
                  while( true ) {
                    iVar44 = asVar47._0_4_;
                    asVar47._0_4_ = iVar44 - 1;
                    asVar47[2] = 0;
                    asVar47[3] = 0;
                    if (iVar44 == 0) break;
                    auVar117 = *(undefined1 (*) [32])((long)pvVar33 + lVar72);
                    auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar72 + 0x20);
                    auVar116 = *(undefined1 (*) [32])(lVar26 + 0x20 + lVar72);
                    auVar105 = vpermw_avx512vl(auVar5,*(undefined1 (*) [32])(lVar26 + lVar72));
                    auVar114 = vpshufd_avx2(auVar105,0x50);
                    auVar115 = vpmullw_avx2(auVar117,auVar114);
                    auVar114 = vpmulhw_avx2(auVar117,auVar114);
                    auVar105 = vpshufd_avx2(auVar105,0xfa);
                    auVar9 = vpmullw_avx2(auVar117,auVar105);
                    auVar105 = vpmulhw_avx2(auVar117,auVar105);
                    auVar106 = vpermw_avx512vl(auVar6,*(undefined1 (*) [32])(lVar26 + lVar72));
                    auVar107 = vpshufd_avx512vl(auVar106,0x50);
                    auVar108 = vpmullw_avx512vl(auVar118,auVar107);
                    auVar107 = vpmulhw_avx512vl(auVar118,auVar107);
                    auVar106 = vpshufd_avx2(auVar106,0xfa);
                    auVar109 = vpmullw_avx512vl(auVar118,auVar106);
                    auVar106 = vpmulhw_avx2(auVar118,auVar106);
                    auVar110 = vpunpcklwd_avx512vl(auVar115,auVar114);
                    auVar110 = vpaddd_avx512vl(auVar110,auVar137._0_32_);
                    auVar111 = vpunpcklwd_avx512vl(auVar9,auVar105);
                    auVar111 = vpaddd_avx512vl(auVar111,auVar134._0_32_);
                    auVar112 = vpunpcklwd_avx512vl(auVar108,auVar107);
                    auVar113 = vpunpcklwd_avx512vl(auVar109,auVar106);
                    auVar114 = vpunpckhwd_avx2(auVar115,auVar114);
                    auVar114 = vpaddd_avx512vl(auVar112,auVar114);
                    auVar114 = vpaddd_avx2(auVar114,auVar110);
                    auVar105 = vpunpckhwd_avx2(auVar9,auVar105);
                    auVar105 = vpaddd_avx512vl(auVar105,auVar113);
                    auVar105 = vpaddd_avx2(auVar105,auVar111);
                    auVar115 = vpunpckhwd_avx512vl(auVar108,auVar107);
                    auVar114 = vpaddd_avx2(auVar115,auVar114);
                    auVar137 = ZEXT3264(auVar114);
                    auVar114 = vpunpckhwd_avx512vl(auVar109,auVar106);
                    auVar114 = vpaddd_avx2(auVar114,auVar105);
                    auVar134 = ZEXT3264(auVar114);
                    auVar105 = vpermw_avx512vl(auVar5,auVar116);
                    auVar114 = vpshufd_avx2(auVar105,0x50);
                    auVar9 = vpmullw_avx2(auVar117,auVar114);
                    auVar114 = vpmulhw_avx2(auVar117,auVar114);
                    auVar105 = vpshufd_avx2(auVar105,0xfa);
                    auVar107 = vpmullw_avx2(auVar117,auVar105);
                    auVar105 = vpmulhw_avx2(auVar117,auVar105);
                    auVar116 = vpermw_avx512vl(auVar6,auVar116);
                    auVar117 = vpshufd_avx2(auVar116,0x50);
                    auVar108 = vpmullw_avx2(auVar118,auVar117);
                    auVar106 = vpmulhw_avx2(auVar118,auVar117);
                    auVar117 = vpshufd_avx2(auVar116,0xfa);
                    auVar110 = vpmullw_avx512vl(auVar118,auVar117);
                    auVar115 = vpmulhw_avx2(auVar118,auVar117);
                    auVar117 = vpunpcklwd_avx2(auVar9,auVar114);
                    auVar117 = vpaddd_avx2(auVar117,auVar132._0_32_);
                    auVar118 = vpunpcklwd_avx2(auVar107,auVar105);
                    auVar118 = vpaddd_avx2(auVar118,auVar119._0_32_);
                    auVar109 = vpunpcklwd_avx2(auVar108,auVar106);
                    auVar111 = vpunpcklwd_avx512vl(auVar110,auVar115);
                    auVar116 = vpunpckhwd_avx2(auVar9,auVar114);
                    auVar116 = vpaddd_avx2(auVar109,auVar116);
                    auVar117 = vpaddd_avx2(auVar116,auVar117);
                    auVar116 = vpunpckhwd_avx2(auVar107,auVar105);
                    auVar116 = vpaddd_avx512vl(auVar111,auVar116);
                    auVar118 = vpaddd_avx2(auVar116,auVar118);
                    auVar116 = vpunpckhwd_avx2(auVar108,auVar106);
                    auVar117 = vpaddd_avx2(auVar116,auVar117);
                    auVar132 = ZEXT3264(auVar117);
                    auVar117 = vpunpckhwd_avx512vl(auVar110,auVar115);
                    auVar117 = vpaddd_avx2(auVar117,auVar118);
                    auVar119 = ZEXT3264(auVar117);
                    lVar72 = lVar72 + 0x40;
                  }
                  auVar106._0_16_ = ZEXT116(0) * auVar134._0_16_ + ZEXT116(1) * auVar137._0_16_;
                  auVar106._16_16_ = ZEXT116(0) * auVar137._16_16_ + ZEXT116(1) * auVar134._0_16_;
                  auVar117 = vperm2i128_avx2(auVar137._0_32_,auVar134._0_32_,0x31);
                  auVar117 = vpaddd_avx2(auVar106,auVar117);
                  *(int *)asVar60 = auVar117._0_4_;
                  *(int *)asVar51 = auVar117._4_4_;
                  auVar105._0_16_ = ZEXT116(0) * auVar119._0_16_ + ZEXT116(1) * auVar132._0_16_;
                  auVar105._16_16_ = ZEXT116(0) * auVar132._16_16_ + ZEXT116(1) * auVar119._0_16_;
                  *(int *)asVar98 = auVar117._8_4_;
                  *(int *)asVar84 = auVar117._12_4_;
                  *(int *)((long)asVar60 + 4) = auVar117._16_4_;
                  *(int *)((long)asVar51 + 4) = auVar117._20_4_;
                  auVar118 = vperm2i128_avx2(auVar132._0_32_,auVar119._0_32_,0x31);
                  *(int *)((long)asVar98 + 4) = auVar117._24_4_;
                  auVar118 = vpaddd_avx2(auVar105,auVar118);
                  *(int *)((long)asVar84 + 4) = auVar117._28_4_;
                  *(int *)((long)asVar60 + 8) = auVar118._0_4_;
                  *(int *)((long)asVar51 + 8) = auVar118._4_4_;
                  *(int *)((long)asVar98 + 8) = auVar118._8_4_;
                  *(int *)((long)asVar84 + 8) = auVar118._12_4_;
                  *(int *)((long)asVar60 + 0xc) = auVar118._16_4_;
                  *(int *)((long)asVar51 + 0xc) = auVar118._20_4_;
                  *(int *)((long)asVar98 + 0xc) = auVar118._24_4_;
                  *(int *)((long)asVar84 + 0xc) = auVar118._28_4_;
                  asVar60 = (short  [4])((long)asVar60 + 0x10);
                  asVar51 = (short  [4])((long)asVar51 + 0x10);
                  asVar98 = (short  [4])((long)asVar98 + 0x10);
                  asVar84 = (short  [4])((long)asVar84 + 0x10);
                  lVar26 = lVar26 + lVar46;
                }
                bVar38 = 0;
                for (; (int)((uint)uVar64 | 1) < (int)uVar55; uVar64 = (ulong)((uint)uVar64 + 2)) {
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  lVar26 = 0;
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  asVar80 = asVar95;
                  while( true ) {
                    iVar44 = asVar80._0_4_;
                    asVar80._0_4_ = iVar44 - 1;
                    asVar80[2] = 0;
                    asVar80[3] = 0;
                    if (iVar44 == 0) break;
                    auVar117 = *(undefined1 (*) [32])
                                ((ulong)((bVar38 & 1) + ((uint)(uVar64 >> 2) & 0x3fffffff)) * lVar46
                                 + opt_q._0_8_ + lVar26);
                    auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar26 * 2);
                    auVar116 = *(undefined1 (*) [32])((long)pvVar33 + lVar26 * 2 + 0x20);
                    auVar105 = vpermw_avx512vl(auVar5,auVar117);
                    auVar114 = vpshufd_avx2(auVar105,0x50);
                    auVar9 = vpmullw_avx2(auVar114,auVar118);
                    auVar114 = vpmulhw_avx2(auVar114,auVar118);
                    auVar105 = vpshufd_avx2(auVar105,0xfa);
                    auVar107 = vpmullw_avx2(auVar105,auVar118);
                    auVar105 = vpmulhw_avx2(auVar105,auVar118);
                    auVar118 = vpermw_avx512vl(auVar6,auVar117);
                    auVar117 = vpshufd_avx2(auVar118,0x50);
                    auVar108 = vpmullw_avx2(auVar116,auVar117);
                    auVar106 = vpmulhw_avx2(auVar116,auVar117);
                    auVar117 = vpshufd_avx2(auVar118,0xfa);
                    auVar109 = vpmullw_avx2(auVar116,auVar117);
                    auVar115 = vpmulhw_avx2(auVar116,auVar117);
                    auVar117 = vpunpcklwd_avx2(auVar9,auVar114);
                    auVar117 = vpaddd_avx2(auVar117,auVar132._0_32_);
                    auVar118 = vpunpcklwd_avx2(auVar107,auVar105);
                    auVar118 = vpaddd_avx2(auVar118,auVar119._0_32_);
                    auVar110 = vpunpcklwd_avx2(auVar108,auVar106);
                    auVar111 = vpunpcklwd_avx2(auVar109,auVar115);
                    auVar116 = vpunpckhwd_avx2(auVar9,auVar114);
                    auVar116 = vpaddd_avx2(auVar110,auVar116);
                    auVar117 = vpaddd_avx2(auVar116,auVar117);
                    auVar116 = vpunpckhwd_avx2(auVar107,auVar105);
                    auVar116 = vpaddd_avx2(auVar111,auVar116);
                    auVar118 = vpaddd_avx2(auVar118,auVar116);
                    auVar116 = vpunpckhwd_avx2(auVar108,auVar106);
                    auVar117 = vpaddd_avx2(auVar117,auVar116);
                    auVar132 = ZEXT3264(auVar117);
                    auVar117 = vpunpckhwd_avx2(auVar109,auVar115);
                    auVar117 = vpaddd_avx2(auVar118,auVar117);
                    auVar119 = ZEXT3264(auVar117);
                    lVar26 = lVar26 + 0x20;
                  }
                  auVar115._0_16_ = ZEXT116(0) * auVar119._0_16_ + ZEXT116(1) * auVar132._0_16_;
                  auVar115._16_16_ = ZEXT116(0) * auVar132._16_16_ + ZEXT116(1) * auVar119._0_16_;
                  auVar117 = vperm2i128_avx2(auVar132._0_32_,auVar119._0_32_,0x31);
                  auVar117 = vpaddd_avx2(auVar115,auVar117);
                  *(int *)asVar60 = auVar117._0_4_;
                  *(int *)asVar51 = auVar117._4_4_;
                  *(int *)asVar98 = auVar117._8_4_;
                  *(int *)asVar84 = auVar117._12_4_;
                  *(int *)((long)asVar60 + 4) = auVar117._16_4_;
                  *(int *)((long)asVar51 + 4) = auVar117._20_4_;
                  *(int *)((long)asVar98 + 4) = auVar117._24_4_;
                  *(int *)((long)asVar84 + 4) = auVar117._28_4_;
                  asVar60 = (short  [4])((long)asVar60 + 8);
                  asVar51 = (short  [4])((long)asVar51 + 8);
                  asVar98 = (short  [4])((long)asVar98 + 8);
                  asVar84 = (short  [4])((long)asVar84 + 8);
                  bVar38 = bVar38 + 1;
                }
                while( true ) {
                  uVar54 = (uint)uVar64;
                  if ((int)uVar55 <= (int)uVar54) break;
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  lVar26 = 0;
                  asVar73 = asVar95;
                  while (iVar44 = asVar73._0_4_, asVar73._0_4_ = iVar44 - 1, asVar73[2] = 0,
                        asVar73[3] = 0, iVar44 != 0) {
                    auVar117 = *(undefined1 (*) [32])((long)pvVar33 + lVar26 * 4);
                    auVar118 = *(undefined1 (*) [32])((long)pvVar33 + lVar26 * 4 + 0x20);
                    auVar114 = ZEXT1632(*(undefined1 (*) [16])
                                         ((ulong)((uVar54 & 1) + ((uint)(uVar64 >> 2) & 0x3fffffff)
                                                 + (uint)((uVar54 >> 1 & 1) != 0)) * lVar46 +
                                          opt_q._0_8_ + lVar26));
                    auVar116 = vpermw_avx512vl(auVar7,auVar114);
                    auVar114 = vpermw_avx512vl(auVar8,auVar114);
                    auVar105 = vpmullw_avx2(auVar116,auVar117);
                    auVar116 = vpmulhw_avx2(auVar116,auVar117);
                    auVar106 = vpmullw_avx2(auVar118,auVar114);
                    auVar114 = vpmulhw_avx2(auVar118,auVar114);
                    auVar117 = vpunpcklwd_avx2(auVar105,auVar116);
                    auVar117 = vpaddd_avx2(auVar119._0_32_,auVar117);
                    auVar115 = vpunpcklwd_avx2(auVar106,auVar114);
                    auVar118 = vpunpckhwd_avx2(auVar105,auVar116);
                    auVar118 = vpaddd_avx2(auVar115,auVar118);
                    auVar117 = vpaddd_avx2(auVar117,auVar118);
                    auVar118 = vpunpckhwd_avx2(auVar106,auVar114);
                    auVar117 = vpaddd_avx2(auVar117,auVar118);
                    auVar119 = ZEXT3264(auVar117);
                    lVar26 = lVar26 + 0x10;
                  }
                  auVar102 = vpaddd_avx(auVar119._0_16_,auVar119._16_16_);
                  *(int *)asVar60 = auVar102._0_4_;
                  *(int *)asVar51 = auVar102._4_4_;
                  *(int *)asVar98 = auVar102._8_4_;
                  *(int *)asVar84 = auVar102._12_4_;
                  asVar60 = (short  [4])((long)asVar60 + 4);
                  asVar51 = (short  [4])((long)asVar51 + 4);
                  asVar98 = (short  [4])((long)asVar98 + 4);
                  asVar84 = (short  [4])((long)asVar84 + 4);
                  uVar64 = (ulong)(uVar54 + 1);
                }
                pvVar33 = (void *)((long)pvVar33 + (long)iVar68 * sVar81);
              }
              local_6f8 = (void *)((long)local_6f8 + (long)local_630);
            }
            pvVar33 = (this->weight_winograd43_data).data;
            sVar81 = (this->weight_winograd43_data).elemsize;
            sVar67 = (this->weight_winograd43_data).cstep;
            for (uVar45 = uVar20 & 0xfffffffffffffffc; (long)uVar45 < (long)uVar20;
                uVar45 = uVar45 + 1) {
              uVar22 = (ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff;
              iVar68 = (this->weight_winograd43_data).w;
              pvVar34 = (void *)((long)((int)((long)uVar22 % 4) + (int)((long)uVar22 / 4)) *
                                 sVar67 * sVar81 + (long)pvVar33);
              asVar84 = d1;
              for (lVar50 = 0; lVar50 != 0x24; lVar50 = lVar50 + 1) {
                lVar46 = (long)(int)opt_q._44_4_ * (long)opt_q.workspace_allocator;
                lVar26 = opt_q._0_8_;
                for (uVar22 = 0; (long)(uVar22 | 3) < lVar70; uVar22 = uVar22 + 4) {
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  lVar72 = 0;
                  auVar133 = ZEXT1664((undefined1  [16])0x0);
                  auVar135 = ZEXT1664((undefined1  [16])0x0);
                  auVar138 = ZEXT1664((undefined1  [16])0x0);
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  auVar134 = ZEXT1664((undefined1  [16])0x0);
                  auVar137 = ZEXT1664((undefined1  [16])0x0);
                  auVar131 = ZEXT1664((undefined1  [16])0x0);
                  asVar74 = asVar95;
                  while( true ) {
                    iVar44 = asVar74._0_4_;
                    asVar74._0_4_ = iVar44 - 1;
                    asVar74[2] = 0;
                    asVar74[3] = 0;
                    if (iVar44 == 0) break;
                    auVar102 = *(undefined1 (*) [16])(lVar26 + lVar72 * 4);
                    auVar101 = *(undefined1 (*) [16])(lVar26 + 0x10 + lVar72 * 4);
                    auVar140 = *(undefined1 (*) [16])(lVar26 + 0x20 + lVar72 * 4);
                    auVar126 = *(undefined1 (*) [16])(lVar26 + 0x30 + lVar72 * 4);
                    auVar103 = *(undefined1 (*) [16])((long)pvVar34 + lVar72);
                    auVar136 = vpmullw_avx(auVar103,auVar102);
                    auVar100 = vpmulhw_avx(auVar102,auVar103);
                    auVar141 = vpmullw_avx(auVar103,auVar101);
                    auVar101 = vpmulhw_avx(auVar101,auVar103);
                    auVar139 = vpmullw_avx(auVar103,auVar140);
                    auVar140 = vpmulhw_avx(auVar140,auVar103);
                    auVar104 = vpmullw_avx512vl(auVar103,auVar126);
                    auVar126 = vpmulhw_avx(auVar126,auVar103);
                    auVar102 = vpunpcklwd_avx(auVar136,auVar100);
                    auVar102 = vpaddd_avx(auVar102,auVar132._0_16_);
                    auVar132 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar136,auVar100);
                    auVar102 = vpaddd_avx(auVar102,auVar133._0_16_);
                    auVar133 = ZEXT1664(auVar102);
                    auVar102 = vpunpcklwd_avx(auVar141,auVar101);
                    auVar102 = vpaddd_avx(auVar102,auVar135._0_16_);
                    auVar135 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar141,auVar101);
                    auVar102 = vpaddd_avx(auVar102,auVar138._0_16_);
                    auVar138 = ZEXT1664(auVar102);
                    auVar102 = vpunpcklwd_avx(auVar139,auVar140);
                    auVar102 = vpaddd_avx(auVar102,auVar119._0_16_);
                    auVar119 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar139,auVar140);
                    auVar102 = vpaddd_avx(auVar102,auVar134._0_16_);
                    auVar134 = ZEXT1664(auVar102);
                    auVar102 = vpunpcklwd_avx512vl(auVar104,auVar126);
                    auVar102 = vpaddd_avx(auVar102,auVar137._0_16_);
                    auVar137 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx512vl(auVar104,auVar126);
                    auVar102 = vpaddd_avx(auVar102,auVar131._0_16_);
                    auVar131 = ZEXT1664(auVar102);
                    lVar72 = lVar72 + 0x10;
                  }
                  auVar102 = vpaddd_avx(auVar133._0_16_,auVar132._0_16_);
                  auVar101 = vpaddd_avx(auVar138._0_16_,auVar135._0_16_);
                  auVar140 = vpshufd_avx(auVar102,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar140);
                  auVar140 = vpshufd_avx(auVar101,0xee);
                  auVar101 = vpaddd_avx(auVar101,auVar140);
                  auVar140 = vphaddd_avx(auVar102,auVar101);
                  auVar102 = vpaddd_avx(auVar134._0_16_,auVar119._0_16_);
                  auVar101 = vpaddd_avx(auVar131._0_16_,auVar137._0_16_);
                  auVar126 = vpshufd_avx(auVar102,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar126);
                  auVar126 = vphaddd_avx(auVar102,auVar102);
                  auVar102 = vpshufd_avx(auVar101,0xee);
                  auVar102 = vpaddd_avx(auVar101,auVar102);
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  auVar101 = vpshufd_avx(auVar140,0xe8);
                  auVar101 = vpunpcklqdq_avx(auVar101,auVar126);
                  uVar129 = auVar102._0_4_;
                  auVar128._4_4_ = uVar129;
                  auVar128._0_4_ = uVar129;
                  auVar128._8_4_ = uVar129;
                  auVar128._12_4_ = uVar129;
                  auVar102 = vpblendd_avx2(auVar101,auVar128,8);
                  *(undefined1 (*) [16])asVar84 = auVar102;
                  asVar84 = (short  [4])((long)asVar84 + 0x10);
                  lVar26 = lVar26 + lVar46;
                }
                uVar54 = 0;
                for (; (int)((uint)uVar22 | 1) < (int)uVar55; uVar22 = (ulong)((uint)uVar22 + 2)) {
                  lVar26 = (ulong)((uVar54 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff)) * lVar46 +
                           opt_q._0_8_;
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  lVar72 = 0;
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  auVar134 = ZEXT1664((undefined1  [16])0x0);
                  auVar137 = ZEXT1664((undefined1  [16])0x0);
                  asVar75 = asVar95;
                  while( true ) {
                    iVar44 = asVar75._0_4_;
                    asVar75._0_4_ = iVar44 - 1;
                    asVar75[2] = 0;
                    asVar75[3] = 0;
                    if (iVar44 == 0) break;
                    auVar102 = *(undefined1 (*) [16])(lVar26 + lVar72 * 2);
                    auVar101 = *(undefined1 (*) [16])(lVar26 + 0x10 + lVar72 * 2);
                    auVar140 = *(undefined1 (*) [16])((long)pvVar34 + lVar72);
                    auVar103 = vpmullw_avx(auVar140,auVar102);
                    auVar126 = vpmulhw_avx(auVar102,auVar140);
                    auVar100 = vpmullw_avx(auVar140,auVar101);
                    auVar101 = vpmulhw_avx(auVar101,auVar140);
                    auVar102 = vpunpcklwd_avx(auVar103,auVar126);
                    auVar102 = vpaddd_avx(auVar119._0_16_,auVar102);
                    auVar119 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar103,auVar126);
                    auVar102 = vpaddd_avx(auVar132._0_16_,auVar102);
                    auVar132 = ZEXT1664(auVar102);
                    auVar102 = vpunpcklwd_avx(auVar100,auVar101);
                    auVar102 = vpaddd_avx(auVar134._0_16_,auVar102);
                    auVar134 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar100,auVar101);
                    auVar102 = vpaddd_avx(auVar137._0_16_,auVar102);
                    auVar137 = ZEXT1664(auVar102);
                    lVar72 = lVar72 + 0x10;
                  }
                  auVar102 = vpaddd_avx(auVar132._0_16_,auVar119._0_16_);
                  auVar101 = vpaddd_avx(auVar137._0_16_,auVar134._0_16_);
                  auVar140 = vpshufd_avx(auVar102,0xee);
                  auVar102 = vpaddd_avx(auVar102,auVar140);
                  auVar140 = vpshufd_avx(auVar101,0xee);
                  auVar101 = vpaddd_avx(auVar101,auVar140);
                  auVar102 = vphaddd_avx(auVar102,auVar101);
                  auVar102 = vpshufd_avx(auVar102,0xe8);
                  *(long *)asVar84 = auVar102._0_8_;
                  asVar84 = (short  [4])((long)asVar84 + 8);
                  uVar54 = (uint)(byte)((char)uVar54 + 1);
                }
                while( true ) {
                  uVar54 = (uint)uVar22;
                  if ((int)uVar55 <= (int)uVar54) break;
                  auVar119 = ZEXT1664((undefined1  [16])0x0);
                  lVar26 = 0;
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  asVar76 = asVar95;
                  while( true ) {
                    iVar44 = asVar76._0_4_;
                    asVar76._0_4_ = iVar44 - 1;
                    asVar76[2] = 0;
                    asVar76[3] = 0;
                    if (iVar44 == 0) break;
                    auVar102 = *(undefined1 (*) [16])
                                ((ulong)((uVar54 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff) +
                                        (uint)((uVar54 >> 1 & 1) != 0)) * lVar46 + opt_q._0_8_ +
                                lVar26);
                    auVar140 = vpmullw_avx(*(undefined1 (*) [16])((long)pvVar34 + lVar26),auVar102);
                    auVar101 = vpmulhw_avx(auVar102,*(undefined1 (*) [16])((long)pvVar34 + lVar26));
                    auVar102 = vpunpcklwd_avx(auVar140,auVar101);
                    auVar102 = vpaddd_avx(auVar119._0_16_,auVar102);
                    auVar119 = ZEXT1664(auVar102);
                    auVar102 = vpunpckhwd_avx(auVar140,auVar101);
                    auVar102 = vpaddd_avx(auVar132._0_16_,auVar102);
                    auVar132 = ZEXT1664(auVar102);
                    lVar26 = lVar26 + 0x10;
                  }
                  auVar102 = vpaddd_avx(auVar132._0_16_,auVar119._0_16_);
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  auVar102 = vphaddd_avx(auVar102,auVar102);
                  *(int *)asVar84 = auVar102._0_4_;
                  asVar84 = (short  [4])((long)asVar84 + 4);
                  uVar22 = (ulong)(uVar54 + 1);
                }
                pvVar34 = (void *)((long)pvVar34 + (long)iVar68 * sVar81);
              }
            }
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_q.blob_allocator == 0) {
                if (opt_q._32_8_ == 0) {
                  free((void *)opt_q._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            auVar12 = (undefined1  [36])opt_b._28_36_;
            d0[0] = 0;
            d0[1] = 0;
            d0[2] = 0;
            d0[3] = 0;
            opt_b._0_12_ = SUB1612((undefined1  [16])0x0,0);
            opt_b._0_28_ = ZEXT1228((undefined1  [12])opt_b._0_12_);
            opt_b._60_4_ = auVar12._32_4_;
            uVar129 = opt_b._60_4_;
            opt_b._0_60_ = ZEXT3260((undefined1  [32])opt_b._0_32_);
            OVar13 = opt_b;
            auVar122._4_4_ = local_628.h;
            auVar122._0_4_ = local_628.w;
            auVar122._8_8_ = 0;
            uVar20 = vpcmpd_avx512vl(auVar122,auVar125,4);
            if ((uVar20 & 3) == 0) {
              piVar61 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
              if (piVar61 != (int *)0x0) {
                LOCK();
                *piVar61 = *piVar61 + 1;
                UNLOCK();
              }
              opt_b.blob_allocator._4_4_ = local_628.refcount._4_4_;
              opt_b.blob_allocator._0_4_ = local_628.refcount._0_4_;
              opt_b._0_8_ = local_628.data;
              opt_b.workspace_allocator = (Allocator *)local_628.elemsize;
              opt_b._28_36_ = OVar13._28_36_;
              opt_b.openmp_blocktime = local_628.elempack;
              opt_b._32_8_ = local_628.allocator;
              opt_b.use_subgroup_shuffle = (bool)(undefined1)local_628.w;
              opt_b.use_image_storage = (bool)local_628.w._1_1_;
              opt_b.use_tensor_storage = (bool)local_628.w._2_1_;
              opt_b.use_reserved_0 = (bool)local_628.w._3_1_;
              opt_b.use_shader_pack8 = (bool)(undefined1)local_628.dims;
              opt_b.use_subgroup_basic = (bool)local_628.dims._1_1_;
              opt_b.use_subgroup_vote = (bool)local_628.dims._2_1_;
              opt_b.use_subgroup_ballot = (bool)local_628.dims._3_1_;
              opt_b.use_local_pool_allocator = (bool)(undefined1)local_628.d;
              opt_b.use_shader_local_memory = (bool)local_628.d._1_1_;
              opt_b.use_cooperative_matrix = (bool)local_628.d._2_1_;
              opt_b.use_winograd23_convolution = (bool)local_628.d._3_1_;
              opt_b.flush_denormals = local_628.h;
              opt_b.use_winograd43_convolution = (bool)(undefined1)local_628.c;
              opt_b.use_winograd63_convolution = (bool)local_628.c._1_1_;
              opt_b.use_reserved_6 = (bool)local_628.c._2_1_;
              opt_b.use_reserved_7 = (bool)local_628.c._3_1_;
              opt_b = (Option)CONCAT460(uVar129,opt_b._0_60_);
              pvVar33 = local_628.data;
              pAVar65 = (Allocator *)local_628.elemsize;
              sVar81 = local_628.cstep;
            }
            else {
              Mat::create((Mat *)&opt_b,asVar27._0_4_,(int)local_648,iVar87,4,1,
                          opt->workspace_allocator);
              sVar81 = 0;
              pvVar33 = (void *)opt_b._0_8_;
              pAVar65 = opt_b.workspace_allocator;
            }
            auVar119 = _d1;
            uVar20 = (ulong)(uint)iVar87;
            if (iVar87 < 1) {
              uVar20 = 0;
            }
            lVar50 = (long)(int)local_650._0_4_;
            local_3f8[0] = 0;
            local_3f8[1] = 0;
            local_3f8[2] = 0;
            local_3f8[3] = 0;
            lVar26 = (long)(int)(uVar55 * 6) * 4;
            local_650 = (short  [4])(lVar70 * 4 + (long)d1);
            local_648 = (void *)((long)(int)(uVar55 * 3) * 4 + (long)d1);
            local_630[0] = d1[0];
            local_630[1] = d1[1];
            local_630[2] = d1[2];
            local_630[3] = d1[3];
            local_538 = (short  [4])((long)pvVar33 + 0xc);
            local_410 = (short  [4])(sVar81 * (long)pAVar65);
            local_408 = (short  [4])((long)pAVar65 * 4);
            for (uVar45 = 0; uVar45 != uVar20; uVar45 = uVar45 + 1) {
              local_6b0 = (int *)local_538;
              asVar36[0] = 0;
              asVar36[1] = 0;
              asVar36[2] = 0;
              asVar36[3] = 0;
              local_530 = uVar45;
              for (; asVar36 != asVar29; asVar36 = (short  [4])((long)asVar36 + 1)) {
                lVar85 = (long)((local_640._0_4_ * asVar36._0_4_) / 6);
                asVar48[0] = 0;
                asVar48[1] = 0;
                asVar48[2] = 0;
                asVar48[3] = 0;
                lVar70 = (long)(int)(uVar55 * 4) * 4 + (long)d1;
                asVar27 = d1;
                lVar46 = (long)(int)(uVar55 * 5) * 4 + (long)d1;
                piVar61 = local_6b0;
                sVar67 = (size_t)local_648;
                lVar72 = (long)d1 + (long)(int)(uVar55 * 2) * 4;
                asVar29 = local_650;
                for (; asVar48 != asVar97; asVar48 = (short  [4])((long)asVar48 + 1)) {
                  asVar84 = asVar27;
                  lVar35 = lVar46;
                  lVar41 = lVar70;
                  sVar66 = sVar67;
                  lVar91 = lVar72;
                  asVar95 = asVar29;
                  for (lVar52 = -5; OVar13 = opt_q, lVar52 != 0; lVar52 = lVar52 + 1) {
                    iVar17 = *(int *)((long)asVar95 + lVar85 * 4);
                    iVar44 = *(int *)(lVar91 + lVar85 * 4);
                    iVar68 = iVar44 + iVar17;
                    iVar17 = iVar17 - iVar44;
                    iVar83 = *(int *)(sVar66 + lVar85 * 4);
                    iVar87 = *(int *)(lVar41 + lVar85 * 4);
                    iVar44 = iVar87 + iVar83;
                    iVar83 = iVar83 - iVar87;
                    *(int *)((long)&opt_q.workspace_allocator + lVar52 * 4 + 4) =
                         iVar68 + *(int *)((long)asVar84 + lVar85 * 4) + iVar44;
                    *(int *)(&opt_q.use_subgroup_shuffle + lVar52 * 4) = iVar17 + iVar83 * 2;
                    aiStack_390[lVar52 + -1] = iVar68 + iVar44 * 4;
                    *(int *)(auStack_378 + lVar52 * 4 + -4) =
                         iVar17 + iVar83 * 8 + *(int *)(lVar35 + lVar85 * 4) * 4;
                    asVar84 = (short  [4])((long)asVar84 + lVar26);
                    asVar95 = (short  [4])((long)asVar95 + lVar26);
                    lVar91 = lVar91 + lVar26;
                    sVar66 = sVar66 + lVar26;
                    lVar41 = lVar41 + lVar26;
                    lVar35 = lVar35 + lVar26;
                  }
                  iVar68 = *(int *)(sVar66 + lVar85 * 4);
                  iVar44 = *(int *)(lVar41 + lVar85 * 4);
                  iVar87 = iVar68 - iVar44;
                  iVar17 = *(int *)((long)asVar95 + lVar85 * 4);
                  iVar83 = *(int *)(lVar91 + lVar85 * 4);
                  iVar92 = iVar17 - iVar83;
                  opt_q.workspace_allocator._4_4_ =
                       (iVar83 + iVar17 + iVar44 + iVar68 + *(int *)((long)asVar84 + lVar85 * 4)) *
                       4;
                  OVar15 = opt_q;
                  opt_q._48_16_ = OVar13._48_16_;
                  opt_q._0_44_ = OVar15._0_44_;
                  opt_q._44_4_ = iVar87 * 8 + iVar92 * 4;
                  local_388._12_4_ =
                       *(int *)(lVar35 + lVar85 * 4) * 0x10 + iVar87 * 0x20 + iVar92 * 4;
                  piVar53 = piVar61;
                  for (lVar52 = 0x14; lVar52 != 0x74; lVar52 = lVar52 + 0x18) {
                    iVar17 = *(int *)((long)aiStack_3e8 + lVar52 + 4);
                    iVar68 = iVar17 + *(int *)((long)aiStack_3e8 + lVar52);
                    iVar17 = *(int *)((long)aiStack_3e8 + lVar52) - iVar17;
                    iVar83 = *(int *)((long)aiStack_3e8 + lVar52 + 8);
                    iVar87 = *(int *)((long)aiStack_3e8 + lVar52 + 0xc);
                    iVar44 = iVar87 + iVar83;
                    iVar83 = iVar83 - iVar87;
                    piVar53[-3] = (*(int *)((long)aiStack_3e8 + lVar52 + -4) + iVar68 + iVar44) /
                                  0x240;
                    piVar53[-2] = (iVar17 + iVar83 * 2) / 0x240;
                    piVar53[-1] = (iVar68 + iVar44 * 4) / 0x240;
                    *piVar53 = (iVar17 + iVar83 * 8 + *(int *)(&opt_q.lightmode + lVar52)) / 0x240;
                    piVar53 = piVar53 + lVar50;
                  }
                  asVar27 = (short  [4])((long)asVar27 + 4);
                  asVar29 = (short  [4])((long)asVar29 + 4);
                  lVar72 = lVar72 + 4;
                  sVar67 = sVar67 + 4;
                  lVar70 = lVar70 + 4;
                  lVar46 = lVar46 + 4;
                  piVar61 = piVar61 + 4;
                }
                local_6b0 = (int *)((long)local_6b0 + (long)(int)opt_b._44_4_ * (long)pAVar65 * 4);
                uVar45 = local_530;
                asVar29 = local_638;
              }
              local_538 = (short  [4])((long)local_538 + sVar81 * (long)pAVar65);
            }
            _d1 = auVar119;
            copy_cut_border((Mat *)&opt_b,&local_628,0,opt_b.flush_denormals - local_628.h,0,
                            opt_b._44_4_ - local_628.w,opt);
            if (opt_b.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_b.blob_allocator = *(int *)opt_b.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_b.blob_allocator == 0) {
                if (opt_b._32_8_ == 0) {
                  free((void *)opt_b._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                }
              }
            }
            if (piStack_500 != (int *)0x0) {
              LOCK();
              *piStack_500 = *piStack_500 + -1;
              UNLOCK();
              if (*piStack_500 == 0) {
                if (pAStack_4e8 == (Allocator *)0x0) {
                  free((void *)d1);
                }
                else {
                  (**(code **)(*(long *)pAStack_4e8 + 0x18))();
                }
              }
            }
            piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
            if (piVar61 != (int *)0x0) {
              LOCK();
              *piVar61 = *piVar61 + -1;
              UNLOCK();
              if (*piVar61 == 0) {
                pvVar33 = local_588.data;
                if (local_588.allocator == (Allocator *)0x0) {
LAB_001cea88:
                  free(pvVar33);
                }
                else {
                  (**(code **)(*(long *)local_588.allocator + 0x18))();
                }
              }
            }
          }
          else {
            uVar96 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar68 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar44 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            iVar92 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
            iVar42 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
            lVar50 = (long)local_628.w;
            uVar89 = uVar96 * uVar28;
            if (opt->use_sgemm_convolution == true) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar89,local_698.c,8,8,
                          opt->workspace_allocator);
              uVar45 = 0;
              uVar89 = iVar83;
              if (iVar83 < 1) {
                uVar89 = 0;
              }
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar45;
              }
              uVar22 = (ulong)uVar96;
              if ((int)uVar96 < 1) {
                uVar22 = uVar45;
              }
              uVar64 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar64 = uVar45;
              }
              for (; uVar45 != uVar64; uVar45 = uVar45 + 1) {
                puVar37 = (undefined8 *)opt_q._0_8_;
                for (uVar90 = 0; uVar90 != uVar22; uVar90 = uVar90 + 1) {
                  for (uVar30 = 0; uVar30 != uVar20; uVar30 = uVar30 + 1) {
                    puVar56 = (undefined8 *)
                              ((long)local_698.data +
                              uVar30 * (long)iVar68 * 8 +
                              local_698.elemsize * (long)local_698.w * (long)iVar44 * uVar90 +
                              local_698.cstep * uVar45 * local_698.elemsize);
                    for (uVar54 = 0; uVar96 = uVar89, uVar54 != uVar55; uVar54 = uVar54 + 1) {
                      while (uVar96 != 0) {
                        *puVar37 = *puVar56;
                        puVar37 = puVar37 + 1;
                        puVar56 = puVar56 + iVar92;
                        uVar96 = uVar96 - 1;
                      }
                      puVar56 = puVar56 + ((long)(iVar17 * iVar42) - (long)(iVar92 * iVar83));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
                UNLOCK();
                if (*(int *)opt_q.blob_allocator == 0) {
                  pvVar33 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001cea88;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            else {
              uVar45 = (ulong)(uint)local_628.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar89,
                         (allocator_type *)&local_588);
              uVar24 = 0;
              if ((int)uVar28 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar96 < 1) {
                uVar96 = uVar24;
              }
              iVar43 = 0;
              uVar22 = uVar20;
              iVar49 = 0;
              for (; uVar24 != uVar96; uVar24 = uVar24 + 1) {
                for (lVar70 = (long)iVar49; (int)uVar22 != lVar70; lVar70 = lVar70 + 1) {
                  *(int *)(opt_q._0_8_ + lVar70 * 4) = iVar43;
                  iVar43 = iVar43 + iVar68;
                }
                iVar43 = iVar43 + (iVar17 * iVar44 - iVar68 * uVar28);
                uVar22 = (ulong)(uint)((int)uVar22 + (int)uVar20);
                iVar49 = iVar49 + (int)uVar20;
              }
              if ((int)uVar89 < 1) {
                uVar89 = 0;
              }
              uVar20 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar20 = 0;
              }
              uVar22 = 0;
              if (0 < iVar83) {
                uVar22 = (ulong)(uint)iVar83;
              }
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if (iVar87 < 1) {
                uVar45 = 0;
              }
              for (uVar64 = 0; uVar64 != uVar45; uVar64 = uVar64 + 1) {
                local_720 = (void *)(local_628.elemsize * local_628.cstep * uVar64 +
                                    (long)local_628.data);
                for (uVar90 = 0; uVar90 != uVar55; uVar90 = uVar90 + 1) {
                  sVar81 = (this->weight_data_tm).cstep;
                  sVar67 = (this->weight_data_tm).elemsize;
                  pvVar33 = (this->weight_data_tm).data;
                  for (uVar30 = 0; uVar30 != uVar22; uVar30 = uVar30 + 1) {
                    iVar68 = 0;
                    pvVar34 = (void *)(sVar81 * uVar64 * sVar67 + (long)pvVar33);
                    for (uVar71 = 0; uVar71 != uVar20; uVar71 = uVar71 + 1) {
                      for (uVar63 = 0; uVar89 != uVar63; uVar63 = uVar63 + 1) {
                        auVar127._8_8_ = 0;
                        auVar127._0_8_ =
                             *(ulong *)((long)local_698.data +
                                       (long)*(int *)(opt_q._0_8_ + uVar63 * 4) * 8 +
                                       local_698.cstep * local_698.elemsize * uVar71 +
                                       (long)(iVar92 * 8 * (int)uVar30) +
                                       (long)local_698.w * uVar90 * (long)iVar42 *
                                       local_698.elemsize);
                        auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                        auVar101 = vpunpcklbw_avx(auVar127,auVar102);
                        auVar130._8_8_ = 0;
                        auVar130._0_8_ = *(ulong *)((long)pvVar34 + uVar63 * 8);
                        auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar130);
                        auVar102 = vpunpcklbw_avx(auVar130,auVar102);
                        auVar125 = vpmullw_avx(auVar102,auVar101);
                        auVar102 = vpmulhw_avx(auVar101,auVar102);
                        auVar101 = vpunpcklwd_avx(auVar125,auVar102);
                        auVar102 = vpunpckhwd_avx(auVar125,auVar102);
                        auVar102 = vpaddd_avx(auVar101,auVar102);
                        auVar102 = vphaddd_avx(auVar102,auVar102);
                        auVar102 = vphaddd_avx(auVar102,auVar102);
                        iVar68 = iVar68 + auVar102._0_4_;
                      }
                      pvVar34 = (void *)((long)pvVar34 + (ulong)uVar89 * 8);
                    }
                    *(int *)((long)local_720 + uVar30 * 4) = iVar68;
                  }
                  local_720 = (void *)((long)local_720 + lVar50 * 4);
                }
              }
LAB_001cb66b:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar44 == 1 && local_640._0_4_ == 1) {
        p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
        uVar28 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar20 = (ulong)uVar28;
        if ((uVar28 == 1) &&
           (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_698,&local_628,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_001caba6;
            opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
            opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
            opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
            Mat::create((Mat *)&opt_q,local_628.w,local_628.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar20 = 0;
            if ((int)uVar55 < 1) {
              uVar55 = 0;
            }
            uVar45 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar45 = uVar20;
            }
            for (; uVar20 != uVar45; uVar20 = uVar20 + 1) {
              puVar31 = (undefined1 *)
                        (local_698.cstep * uVar20 * local_698.elemsize + (long)local_698.data);
              lVar50 = opt_q._0_8_;
              for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                puVar62 = puVar31 + (iVar17 - iVar83) * 2;
                puVar78 = puVar31;
                for (lVar70 = 0; (int)lVar70 + 3 < iVar83; lVar70 = lVar70 + 4) {
                  *(undefined1 *)(lVar50 + lVar70) = *puVar78;
                  *(undefined1 *)(lVar50 + 1 + lVar70) = puVar78[2];
                  *(undefined1 *)(lVar50 + 2 + lVar70) = puVar78[4];
                  *(undefined1 *)(lVar50 + 3 + lVar70) = puVar78[6];
                  puVar78 = puVar78 + 8;
                  puVar62 = puVar62 + 8;
                }
                for (; (int)lVar70 + 1 < iVar83; lVar70 = lVar70 + 2) {
                  *(undefined1 *)(lVar50 + lVar70) = *puVar78;
                  *(undefined1 *)(lVar50 + 1 + lVar70) = puVar78[2];
                  puVar78 = puVar78 + 4;
                  puVar62 = puVar62 + 4;
                }
                for (; (int)lVar70 < iVar83; lVar70 = lVar70 + 1) {
                  *(undefined1 *)(lVar50 + lVar70) = puVar31[lVar70 * 2];
                  puVar62 = puVar62 + 2;
                }
                lVar50 = lVar50 + lVar70;
                puVar31 = puVar62;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
            if (opt_q.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_q.blob_allocator == 0) {
                pvVar33 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001cea88;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001caba6:
          if ((((opt->use_winograd_convolution != true) || (uVar28 != 3)) ||
              ((opt->use_winograd23_convolution == false ||
               (((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3 ||
                 (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))))) ||
             (((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)) ||
              ((iVar44 * local_638._0_4_ < 0x10 ||
               (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10)))))) {
            uVar96 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar68 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar44 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            iVar92 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
            lVar50 = (long)iVar92;
            iVar42 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
            lVar70 = (long)local_628.w;
            uVar45 = (ulong)(uint)local_628.h;
            uVar89 = uVar96 * uVar28;
            uVar22 = (ulong)uVar89;
            if (opt->use_sgemm_convolution == true) {
              opt_q._0_28_ = ZEXT1228((undefined1  [12])0x0);
              opt_q._0_60_ = ZEXT3260((undefined1  [32])opt_q._0_32_);
              opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
              Mat::create((Mat *)&opt_q,local_628.h * local_628.w,uVar89,local_698.c,1,1,
                          opt->workspace_allocator);
              lVar70 = (long)(iVar92 * 2);
              uVar45 = 0;
              if ((int)uVar55 < 1) {
                uVar55 = 0;
              }
              if ((int)uVar28 < 1) {
                uVar20 = uVar45;
              }
              uVar22 = (ulong)uVar96;
              if ((int)uVar96 < 1) {
                uVar22 = uVar45;
              }
              uVar64 = (ulong)uVar54;
              if ((int)uVar54 < 1) {
                uVar64 = uVar45;
              }
              for (; uVar45 != uVar64; uVar45 = uVar45 + 1) {
                lVar26 = opt_q._0_8_;
                for (uVar90 = 0; uVar90 != uVar22; uVar90 = uVar90 + 1) {
                  for (uVar30 = 0; uVar30 != uVar20; uVar30 = uVar30 + 1) {
                    puVar31 = (undefined1 *)
                              ((long)local_698.data +
                              uVar30 * (long)iVar68 +
                              (long)local_698.w * local_698.elemsize * (long)iVar44 * uVar90 +
                              local_698.cstep * uVar45 * local_698.elemsize);
                    for (uVar54 = 0; uVar54 != uVar55; uVar54 = uVar54 + 1) {
                      lVar72 = 0;
                      puVar62 = puVar31;
                      for (lVar46 = 0; (int)lVar46 + 3 < iVar83; lVar46 = lVar46 + 4) {
                        *(undefined1 *)(lVar26 + lVar46) = *puVar62;
                        *(undefined1 *)(lVar26 + 1 + lVar46) = puVar62[lVar50];
                        *(undefined1 *)(lVar26 + 2 + lVar46) = puVar62[lVar70];
                        *(undefined1 *)(lVar26 + 3 + lVar46) = puVar62[iVar92 * 3];
                        puVar62 = puVar62 + iVar92 * 4;
                        lVar72 = lVar72 + iVar92 * 4;
                      }
                      for (; (int)lVar46 + 1 < iVar83; lVar46 = lVar46 + 2) {
                        *(undefined1 *)(lVar26 + lVar46) = *puVar62;
                        *(undefined1 *)(lVar26 + 1 + lVar46) = puVar62[lVar50];
                        puVar62 = puVar62 + lVar70;
                        lVar72 = lVar72 + lVar70;
                      }
                      for (; (int)lVar46 < iVar83; lVar46 = lVar46 + 1) {
                        *(undefined1 *)(lVar26 + lVar46) = puVar31[lVar72];
                        lVar72 = lVar72 + lVar50;
                      }
                      puVar31 = puVar31 + lVar72 + (iVar17 * iVar42 - iVar83 * iVar92);
                      lVar26 = lVar26 + lVar46;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_628,&this->weight_sgemm_data,opt);
              if (opt_q.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
                UNLOCK();
                if (*(int *)opt_q.blob_allocator == 0) {
                  pvVar33 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001cea88;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001cb678;
            }
            uVar64 = (ulong)(uint)local_628.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar89,
                       (allocator_type *)&local_588);
            iVar92 = 0;
            if ((int)uVar28 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar96 < 1) {
              uVar96 = 0;
            }
            uVar90 = uVar20;
            iVar49 = 0;
            for (uVar24 = 0; uVar24 != uVar96; uVar24 = uVar24 + 1) {
              for (lVar26 = (long)iVar49; (int)uVar90 != lVar26; lVar26 = lVar26 + 1) {
                *(int *)(opt_q._0_8_ + lVar26 * 4) = iVar92;
                iVar92 = iVar92 + iVar68;
              }
              iVar92 = iVar92 + (iVar17 * iVar44 - iVar68 * uVar28);
              uVar90 = (ulong)(uint)((int)uVar90 + (int)uVar20);
              iVar49 = iVar49 + (int)uVar20;
            }
            local_638 = (short  [4])(local_628.elemsize * local_628.cstep);
            local_640._0_4_ = uVar54 * uVar89;
            if ((int)uVar89 < 1) {
              uVar22 = 0;
            }
            uVar20 = (ulong)uVar54;
            if ((int)uVar54 < 1) {
              uVar20 = 0;
            }
            uVar90 = 0;
            if (0 < iVar83) {
              uVar90 = (ulong)(uint)iVar83;
            }
            if ((int)uVar55 < 1) {
              uVar45 = 0;
            }
            if (iVar87 < 1) {
              uVar64 = 0;
            }
            for (uVar30 = 0; uVar30 != uVar64; uVar30 = uVar30 + 1) {
              local_720 = (void *)((long)local_638 * uVar30 + (long)local_628.data);
              for (uVar71 = 0; uVar71 != uVar45; uVar71 = uVar71 + 1) {
                pvVar33 = (this->weight_data_tm).data;
                for (uVar63 = 0; uVar63 != uVar90; uVar63 = uVar63 + 1) {
                  iVar68 = 0;
                  lVar26 = (long)pvVar33 + (long)(int)(uVar54 * uVar89 * (int)uVar30);
                  for (uVar32 = 0; uVar32 != uVar20; uVar32 = uVar32 + 1) {
                    for (uVar79 = 0; uVar22 != uVar79; uVar79 = uVar79 + 1) {
                      iVar68 = iVar68 + (int)*(char *)(lVar26 + uVar79) *
                                        (int)*(char *)((long)local_698.data +
                                                      (long)*(int *)(opt_q._0_8_ + uVar79 * 4) +
                                                      local_698.cstep * local_698.elemsize * uVar32
                                                      + uVar63 * lVar50 +
                                                        (long)local_698.w * uVar71 * (long)iVar42 *
                                                        local_698.elemsize);
                    }
                    lVar26 = lVar26 + (int)uVar89;
                  }
                  *(int *)((long)local_720 + uVar63 * 4) = iVar68;
                }
                local_720 = (void *)((long)local_720 + lVar70 * 4);
              }
            }
            goto LAB_001cb66b;
          }
          lVar50 = (long)local_698.c;
          uVar20 = (ulong)local_628.c;
          piVar61 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
          opt_q.blob_allocator._4_4_ = local_698.refcount._4_4_;
          opt_q.blob_allocator._0_4_ = local_698.refcount._0_4_;
          opt_q._0_8_ = local_698.data;
          opt_q.workspace_allocator = (Allocator *)local_698.elemsize;
          opt_q.openmp_blocktime = local_698.elempack;
          opt_q._32_8_ = local_698.allocator;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_698.w;
          opt_q.use_image_storage = (bool)local_698.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_698.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_698.w._3_1_;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_698.dims;
          opt_q.use_subgroup_basic = (bool)local_698.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_698.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_698.dims._3_1_;
          opt_q.use_local_pool_allocator = (bool)(undefined1)local_698.d;
          opt_q.use_shader_local_memory = (bool)local_698.d._1_1_;
          opt_q.use_cooperative_matrix = (bool)local_698.d._2_1_;
          opt_q.use_winograd23_convolution = (bool)local_698.d._3_1_;
          opt_q.flush_denormals = local_698.h;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_698.c;
          opt_q.use_winograd63_convolution = (bool)local_698.c._1_1_;
          opt_q.use_reserved_6 = (bool)local_698.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_698.c._3_1_;
          opt_q = (Option)CONCAT460(uVar129,opt_q._0_60_);
          if (piVar61 != (int *)0x0) {
            LOCK();
            *piVar61 = *piVar61 + 1;
            UNLOCK();
          }
          uVar45 = (long)(int)(local_628.w + 1) / 2;
          local_400 = uVar45 & 0xffffffff;
          uVar22 = (long)(int)(local_628.h + 1) / 2;
          iVar68 = (int)uVar22;
          aiStack_3e8[2] = iVar68 * 2;
          iVar44 = (int)uVar45 * 2 + 2;
          auVar119 = vmovdqu64_avx512f((undefined1  [64])*opt);
          auVar119 = vmovdqu64_avx512f(auVar119);
          opt_b._16_48_ = auVar119._16_48_;
          opt_b._0_8_ = auVar119._0_8_;
          opt_b.blob_allocator = opt->workspace_allocator;
          copy_make_border(&local_698,(Mat *)&opt_q,0,(aiStack_3e8[2] - local_698.h) + 2,0,
                           iVar44 - local_698.w,0,0.0,&opt_b);
          local_588.cstep = 0;
          uVar89 = iVar68 * (int)local_400;
          local_588.data = (void *)0x0;
          local_588.refcount._0_4_ = 0;
          local_588.refcount._4_4_ = 0;
          local_588.elemsize = 0;
          local_588.elempack = 0;
          local_588.allocator = (Allocator *)0x0;
          local_588.dims = 0;
          local_588.w = 0;
          local_588.h = 0;
          local_588.d = 0;
          local_588.c = 0;
          Mat::create(&local_588,0x10,uVar89,uVar54,2,opt->workspace_allocator);
          pvVar33 = local_588.data;
          uVar55 = (uint)local_400;
          aiStack_3e8[1] = uVar55 * 2;
          lVar70 = (long)opt_q.workspace_allocator * sVar81;
          lVar26 = local_588.elemsize * local_588.cstep;
          uVar14 = opt_q._0_8_;
          lVar46 = (long)iVar44;
          uVar45 = 0;
          uVar28 = 0;
          if (0 < (int)uVar55) {
            uVar28 = uVar55;
          }
          uVar22 = uVar22 & 0xffffffff;
          if (iVar68 < 1) {
            uVar22 = uVar45;
          }
          uVar64 = 0;
          if (0 < (int)uVar54) {
            uVar64 = (ulong)uVar54;
          }
          for (; uVar45 != uVar64; uVar45 = uVar45 + 1) {
            pvVar34 = (void *)(lVar26 * uVar45 + (long)pvVar33);
            for (uVar90 = 0; uVar90 != uVar22; uVar90 = uVar90 + 1) {
              lVar35 = (long)(iVar44 * 2 * (int)uVar90) + lVar70 * uVar45 + uVar14;
              lVar72 = lVar35 + lVar46;
              lVar85 = lVar46 + lVar72;
              lVar52 = lVar85 + lVar46;
              for (uVar55 = 0; uVar55 != uVar28; uVar55 = uVar55 + 1) {
                for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                  d0[lVar41] = (short)*(char *)(lVar35 + lVar41);
                  d1[lVar41] = (short)*(char *)(lVar72 + lVar41);
                  d2[lVar41] = (short)*(char *)(lVar85 + lVar41);
                  d3[lVar41] = (short)*(char *)(lVar52 + lVar41);
                }
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  sVar1 = *(short *)((long)d2 + lVar41);
                  *(short *)((long)w0 + lVar41) = *(short *)((long)d0 + lVar41) - sVar1;
                  sVar2 = *(short *)((long)d1 + lVar41);
                  *(short *)((long)w1 + lVar41) = sVar2 + sVar1;
                  *(short *)((long)w2 + lVar41) = sVar1 - sVar2;
                  *(short *)((long)w3 + lVar41) = *(short *)((long)d3 + lVar41) - sVar2;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  sVar1 = *(short *)((long)t2 + lVar41);
                  *(short *)((long)d0 + lVar41) = *(short *)((long)t0 + lVar41) - sVar1;
                  sVar2 = *(short *)((long)t1 + lVar41);
                  *(short *)((long)d1 + lVar41) = sVar2 + sVar1;
                  *(short *)((long)d2 + lVar41) = sVar1 - sVar2;
                  *(short *)((long)d3 + lVar41) = *(short *)((long)t3 + lVar41) - sVar2;
                }
                for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
                  *(undefined2 *)((long)pvVar34 + lVar41) = *(undefined2 *)((long)d0 + lVar41);
                  *(undefined2 *)((long)pvVar34 + lVar41 + 8) = *(undefined2 *)((long)d1 + lVar41);
                  *(undefined2 *)((long)pvVar34 + lVar41 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar41);
                  *(undefined2 *)((long)pvVar34 + lVar41 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar41);
                }
                lVar35 = lVar35 + 2;
                lVar72 = lVar72 + 2;
                lVar85 = lVar85 + 2;
                lVar52 = lVar52 + 2;
                pvVar34 = (void *)((long)pvVar34 + 0x20);
              }
            }
          }
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
            UNLOCK();
            if (*(int *)opt_q.blob_allocator == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q._0_12_ = SUB1612((undefined1  [16])0x0,0);
          opt_q._0_28_ = ZEXT1228((undefined1  [12])opt_q._0_12_);
          OVar13 = opt_q;
          opt_q._0_44_ = OVar13._0_44_;
          opt_q._0_60_ = ZEXT4460((undefined1  [44])opt_q._0_44_);
          opt_q._0_32_ = OVar13._0_32_;
          opt_q._0_48_ = ZEXT3248((undefined1  [32])opt_q._0_32_);
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          Mat::create((Mat *)d0,0x10,uVar89,iVar87,4,opt->workspace_allocator);
          sVar81 = (this->weight_winograd23_data).elemsize;
          lVar70 = (this->weight_winograd23_data).cstep * sVar81;
          uVar64 = 0;
          uVar45 = (ulong)uVar89;
          if ((int)uVar89 < 1) {
            uVar45 = uVar64;
          }
          local_650 = (short  [4])(this->weight_winograd23_data).data;
          uVar90 = (ulong)uVar96;
          if ((int)uVar96 < 1) {
            uVar90 = uVar64;
          }
          lVar26 = lVar70 * 4;
          local_468 = (void *)(lVar70 * 3 + (long)local_650);
          local_648 = (void *)((long)local_650 + lVar70 * 2);
          local_410[0] = d0[0];
          local_410[1] = d0[1];
          local_410[2] = d0[2];
          local_410[3] = d0[3];
          local_538[0] = d0[0];
          local_538[1] = d0[1];
          local_538[2] = d0[2];
          local_538[3] = d0[3];
          local_408[0] = d0[0];
          local_408[1] = d0[1];
          local_408[2] = d0[2];
          local_408[3] = d0[3];
          auVar119 = ZEXT1664((undefined1  [16])0x0);
          local_448 = (void *)((long)local_650 + lVar70);
          for (; uVar64 != uVar90; uVar64 = uVar64 + 1) {
            lVar46 = (long)(this->weight_winograd23_data).w;
            local_530 = 0;
            lVar72 = sVar81 * lVar46;
            lVar46 = lVar46 * sVar81 * 4;
            local_3f8[0] = d0[0];
            local_3f8[1] = d0[1];
            local_3f8[2] = d0[2];
            local_3f8[3] = d0[3];
            for (uVar30 = 0; uVar30 != uVar45; uVar30 = uVar30 + 1) {
              _d1 = vmovdqu64_avx512f(auVar119);
              _d2 = vmovdqu64_avx512f(auVar119);
              _d3 = vmovdqu64_avx512f(auVar119);
              _w0 = vmovdqu64_avx512f(auVar119);
              local_630 = (short  [4])(local_588.elemsize * local_588.cstep);
              lVar52 = (long)local_588.w * uVar30;
              pvVar82 = (void *)((local_588.cstep * 3 + lVar52) * local_588.elemsize +
                                (long)local_588.data);
              lVar85 = (long)local_630 * 4;
              pvVar86 = (void *)((lVar52 + local_588.cstep * 2) * local_588.elemsize +
                                (long)local_588.data);
              pvVar99 = (void *)((local_588.cstep + lVar52) * local_588.elemsize +
                                (long)local_588.data);
              pvVar77 = (void *)(lVar52 * local_588.elemsize + (long)local_588.data);
              local_708 = local_648;
              pvVar33 = local_448;
              pvVar34 = local_468;
              asVar27 = local_650;
              for (uVar71 = 0; (long)(uVar71 | 3) < lVar50; uVar71 = uVar71 + 4) {
                for (lVar52 = 0; lVar52 != 0x20; lVar52 = lVar52 + 2) {
                  iVar83 = (int)*(short *)((long)pvVar77 + lVar52);
                  iVar68 = (int)*(short *)((long)pvVar99 + lVar52);
                  iVar44 = (int)*(short *)((long)pvVar86 + lVar52);
                  iVar17 = (int)*(short *)((long)pvVar82 + lVar52);
                  *(int *)(d1 + lVar52) =
                       *(short *)((long)asVar27 + lVar52 + 0x60) * iVar17 +
                       *(short *)((long)asVar27 + lVar52 + 0x40) * iVar44 +
                       *(short *)((long)asVar27 + lVar52 + 0x20) * iVar68 +
                       *(short *)((long)asVar27 + lVar52) * iVar83 + *(int *)(d1 + lVar52);
                  lVar35 = lVar70 + lVar52;
                  *(int *)(d2 + lVar52) =
                       *(short *)((long)asVar27 + lVar70 + 0x60 + lVar52) * iVar17 +
                       *(short *)((long)asVar27 + lVar70 + 0x40 + lVar52) * iVar44 +
                       *(short *)((long)asVar27 + lVar70 + 0x20 + lVar52) * iVar68 +
                       *(short *)((long)asVar27 + lVar70 + lVar52) * iVar83 + *(int *)(d2 + lVar52);
                  lVar41 = lVar70 + lVar35;
                  *(int *)(d3 + lVar52) =
                       *(short *)((long)asVar27 + lVar70 + 0x60 + lVar35) * iVar17 +
                       *(short *)((long)asVar27 + lVar70 + 0x40 + lVar35) * iVar44 +
                       *(short *)((long)asVar27 + lVar70 + 0x20 + lVar35) * iVar68 +
                       *(short *)((long)asVar27 + lVar70 + lVar35) * iVar83 + *(int *)(d3 + lVar52);
                  *(int *)(w0 + lVar52) =
                       *(short *)((long)asVar27 + lVar70 + 0x60 + lVar41) * iVar17 +
                       *(short *)((long)asVar27 + lVar70 + 0x40 + lVar41) * iVar44 +
                       *(short *)((long)asVar27 + lVar70 + 0x20 + lVar41) * iVar68 +
                       *(short *)((long)asVar27 + lVar70 + lVar41) * iVar83 + *(int *)(w0 + lVar52);
                }
                pvVar82 = (void *)((long)pvVar82 + lVar85);
                pvVar86 = (void *)((long)pvVar86 + lVar85);
                pvVar99 = (void *)((long)pvVar99 + lVar85);
                asVar27 = (short  [4])((long)asVar27 + lVar46);
                pvVar77 = (void *)((long)pvVar77 + lVar85);
                pvVar34 = (void *)((long)pvVar34 + lVar46);
                local_708 = (void *)((long)local_708 + lVar46);
                pvVar33 = (void *)((long)pvVar33 + lVar46);
              }
              for (; (long)uVar71 < lVar50; uVar71 = uVar71 + 1) {
                for (lVar85 = 0; lVar85 != 0x20; lVar85 = lVar85 + 2) {
                  iVar68 = (int)*(short *)((long)pvVar77 + lVar85);
                  *(int *)(d1 + lVar85) =
                       *(int *)(d1 + lVar85) + *(short *)((long)asVar27 + lVar85) * iVar68;
                  *(int *)(d2 + lVar85) =
                       *(int *)(d2 + lVar85) + *(short *)((long)pvVar33 + lVar85) * iVar68;
                  *(int *)(d3 + lVar85) =
                       *(int *)(d3 + lVar85) + *(short *)((long)local_708 + lVar85) * iVar68;
                  *(int *)(w0 + lVar85) =
                       *(int *)(w0 + lVar85) + *(short *)((long)pvVar34 + lVar85) * iVar68;
                }
                pvVar34 = (void *)((long)pvVar34 + lVar72);
                local_708 = (void *)((long)local_708 + lVar72);
                pvVar33 = (void *)((long)pvVar33 + lVar72);
                asVar27 = (short  [4])((long)asVar27 + lVar72);
                pvVar77 = (void *)((long)pvVar77 + (long)local_630);
              }
              for (lVar85 = 0; lVar85 != 0x40; lVar85 = lVar85 + 4) {
                *(undefined4 *)((long)local_538 + lVar85) = *(undefined4 *)((long)d1 + lVar85);
                *(undefined4 *)((long)local_408 + lVar85) = *(undefined4 *)((long)d2 + lVar85);
                *(undefined4 *)((long)local_410 + lVar85) = *(undefined4 *)((long)d3 + lVar85);
                *(undefined4 *)((long)d0 + lVar85) = *(undefined4 *)((long)w0 + lVar85);
              }
              local_640 = d0;
              local_638 = local_410;
            }
            local_650 = (short  [4])((long)local_650 + lVar26);
            local_468 = (void *)((long)local_468 + lVar26);
            local_648 = (void *)((long)local_648 + lVar26);
            local_448 = (void *)((long)local_448 + lVar26);
          }
          uVar64 = uVar20 & 0xfffffffffffffffc;
          local_648 = (void *)(this->weight_winograd23_data).elemsize;
          lVar70 = (this->weight_winograd23_data).cstep * (long)local_648;
          local_710 = (void *)(lVar70 * uVar64 + (long)(this->weight_winograd23_data).data);
          local_530 = (long)local_648 * 4;
          local_538 = (short  [4])0x0;
          while( true ) {
            local_650[0] = d0[0];
            local_650[1] = d0[1];
            local_650[2] = d0[2];
            local_650[3] = d0[3];
            if ((long)uVar20 <= (long)uVar64) break;
            lVar26 = (long)(this->weight_winograd23_data).w;
            local_640 = (short  [4])((long)local_648 * lVar26);
            lVar46 = (long)local_648 * 4 * lVar26;
            local_638 = (short  [4])(lVar26 * (long)local_648 * 2 + (long)local_710);
            local_630 = (short  [4])((long)local_710 + (long)local_640);
            for (uVar90 = 0; uVar90 != uVar45; uVar90 = uVar90 + 1) {
              _d1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
              lVar85 = (long)local_588.w * uVar90;
              pvVar86 = (void *)((local_588.cstep * 3 + lVar85) * local_588.elemsize +
                                (long)local_588.data);
              lVar72 = local_588.elemsize * local_588.cstep * 4;
              pvVar77 = (void *)((lVar85 + local_588.cstep * 2) * local_588.elemsize +
                                (long)local_588.data);
              pvVar99 = (void *)((local_588.cstep + lVar85) * local_588.elemsize +
                                (long)local_588.data);
              pvVar82 = (void *)(lVar85 * local_588.elemsize + (long)local_588.data);
              pvVar33 = local_710;
              asVar27 = local_630;
              pvVar34 = (void *)((long)local_648 * 3 * lVar26 + (long)local_710);
              asVar97 = local_638;
              for (uVar30 = 0; (long)(uVar30 | 3) < lVar50; uVar30 = uVar30 + 4) {
                for (lVar85 = 0; lVar85 != 0x20; lVar85 = lVar85 + 2) {
                  *(int *)(d1 + lVar85) =
                       (int)*(short *)((long)pvVar34 + lVar85) *
                       (int)*(short *)((long)pvVar86 + lVar85) +
                       (int)*(short *)((long)asVar97 + lVar85) *
                       (int)*(short *)((long)pvVar77 + lVar85) +
                       (int)*(short *)((long)asVar27 + lVar85) *
                       (int)*(short *)((long)pvVar99 + lVar85) +
                       (int)*(short *)((long)pvVar33 + lVar85) *
                       (int)*(short *)((long)pvVar82 + lVar85) + *(int *)(d1 + lVar85);
                }
                pvVar34 = (void *)((long)pvVar34 + lVar46);
                pvVar86 = (void *)((long)pvVar86 + lVar72);
                asVar97 = (short  [4])((long)asVar97 + lVar46);
                pvVar77 = (void *)((long)pvVar77 + lVar72);
                asVar27 = (short  [4])((long)asVar27 + lVar46);
                pvVar99 = (void *)((long)pvVar99 + lVar72);
                pvVar33 = (void *)((long)pvVar33 + lVar46);
                pvVar82 = (void *)((long)pvVar82 + lVar72);
              }
              for (; (long)uVar30 < lVar50; uVar30 = uVar30 + 1) {
                for (lVar72 = 0; lVar72 != 0x10; lVar72 = lVar72 + 1) {
                  *(int *)(d1 + lVar72 * 2) =
                       *(int *)(d1 + lVar72 * 2) +
                       (int)*(short *)((long)pvVar33 + lVar72 * 2) *
                       (int)*(short *)((long)pvVar82 + lVar72 * 2);
                }
                pvVar33 = (void *)((long)pvVar33 + (long)local_640);
                pvVar82 = (void *)((long)pvVar82 + local_588.elemsize * local_588.cstep);
              }
              for (lVar72 = 0; lVar72 != 0x10; lVar72 = lVar72 + 1) {
                *(undefined4 *)((long)d0 + lVar72 * 4) = *(undefined4 *)(d1 + lVar72 * 2);
              }
            }
            uVar64 = uVar64 + 1;
            local_710 = (void *)((long)local_710 + lVar70);
          }
          piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
          asVar27 = d0;
          if (piVar61 != (int *)0x0) {
            LOCK();
            *piVar61 = *piVar61 + -1;
            UNLOCK();
            asVar27 = local_650;
            if (*piVar61 == 0) {
              local_650 = d0;
              if (local_588.allocator == (Allocator *)0x0) {
                free(local_588.data);
                asVar27 = local_650;
              }
              else {
                (**(code **)(*(long *)local_588.allocator + 0x18))();
                asVar27 = local_650;
              }
            }
          }
          local_650 = asVar27;
          auVar12 = auStack_4ec;
          local_588.cstep = 0;
          local_588.data = (void *)0x0;
          local_588.refcount._0_4_ = 0;
          local_588.refcount._4_4_ = 0;
          local_588.elemsize = 0;
          local_588.elempack = 0;
          local_588.h = 0;
          local_588.d = 0;
          local_588.c = 0;
          local_588.allocator = (Allocator *)0x0;
          local_588.dims = 0;
          local_588.w = 0;
          _d1 = SUB1612((undefined1  [16])0x0,0);
          _d1 = ZEXT1228(_d1);
          auStack_4ec._32_4_ = auVar12._32_4_;
          _d1 = ZEXT3260(_d1);
          Mat::create((Mat *)d1,aiStack_3e8[1],aiStack_3e8[2],iVar87,4,opt->workspace_allocator);
          uVar45 = 0;
          uVar20 = (ulong)(uint)iVar87;
          if (iVar87 < 1) {
            uVar20 = uVar45;
          }
          for (; uVar45 != uVar20; uVar45 = uVar45 + 1) {
            for (uVar64 = 0; uVar64 != uVar22; uVar64 = uVar64 + 1) {
              puVar37 = (undefined8 *)(uVar64 * 2 * (long)iStack_4dc * sStack_4f8 + (long)d1);
              puVar56 = (undefined8 *)((uVar64 * 2 + 1) * (long)iStack_4dc * sStack_4f8 + (long)d1);
              for (uVar90 = 0; uVar90 != uVar28; uVar90 = uVar90 + 1) {
                for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 4) {
                  *(undefined4 *)((long)d2 + lVar50) = *(undefined4 *)((long)d0 + lVar50);
                  *(undefined4 *)((long)d3 + lVar50) = *(undefined4 *)((long)d0 + 0x10 + lVar50);
                  *(undefined4 *)((long)w0 + lVar50) = *(undefined4 *)((long)d0 + 0x20 + lVar50);
                  *(undefined4 *)((long)w1 + lVar50) = *(undefined4 *)((long)d0 + 0x30 + lVar50);
                }
                for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 4) {
                  *(int *)((long)w2 + lVar50) =
                       *(int *)((long)d2 + lVar50) + *(int *)((long)d3 + lVar50) +
                       *(int *)((long)w0 + lVar50);
                  *(int *)((long)w3 + lVar50) =
                       (*(int *)((long)d3 + lVar50) - *(int *)((long)w0 + lVar50)) +
                       *(int *)((long)w1 + lVar50);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2._0_4_ = local_420;
                t2._4_4_ = local_430;
                t3._0_4_ = local_41c;
                t3._4_4_ = local_42c;
                for (lVar50 = 0; lVar50 != 8; lVar50 = lVar50 + 4) {
                  *(int *)((long)o0 + lVar50) =
                       *(int *)((long)t0 + lVar50) + *(int *)((long)t1 + lVar50) +
                       *(int *)((long)t2 + lVar50);
                  *(int *)((long)o0 + lVar50 + -8) =
                       (*(int *)((long)t1 + lVar50) - *(int *)((long)t2 + lVar50)) +
                       *(int *)((long)t3 + lVar50);
                }
                auVar123._8_8_ = 0;
                auVar123._0_4_ = o0[0];
                auVar123._4_4_ = o0[1];
                auVar102 = vpsrad_avx(auVar123,2);
                *puVar37 = auVar102._0_8_;
                auVar124._8_8_ = 0;
                auVar124._0_8_ = local_158;
                auVar102 = vpsrad_avx(auVar124,2);
                *puVar56 = auVar102._0_8_;
                puVar37 = puVar37 + 1;
                puVar56 = puVar56 + 1;
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_628,0,iStack_4d8 - local_628.h,0,iStack_4dc - local_628.w
                          ,opt);
          if (piStack_500 != (int *)0x0) {
            LOCK();
            *piStack_500 = *piStack_500 + -1;
            UNLOCK();
            if (*piStack_500 == 0) {
              if (pAStack_4e8 == (Allocator *)0x0) {
                free((void *)d1);
              }
              else {
                (**(code **)(*(long *)pAStack_4e8 + 0x18))();
              }
            }
          }
          piVar61 = (int *)CONCAT44(local_588.refcount._4_4_,local_588.refcount._0_4_);
          if (piVar61 != (int *)0x0) {
            LOCK();
            *piVar61 = *piVar61 + -1;
            UNLOCK();
            if (*piVar61 == 0) {
              if (local_588.allocator == (Allocator *)0x0) {
                free(local_588.data);
              }
              else {
                (**(code **)(*(long *)local_588.allocator + 0x18))();
              }
            }
          }
          if (opt_q.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)opt_q.blob_allocator = *(int *)opt_q.blob_allocator + -1;
            UNLOCK();
            if (*(int *)opt_q.blob_allocator == 0) {
              pvVar33 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001cea88;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
LAB_001cb678:
    p_Var3 = this->_vptr_Convolution_x86_avx512[-3];
    if (aiStack_3e8[3] < 0x65) {
      dequantize_from_int32
                (&local_628,local_3f0,&this->scale_in_data,
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->scale_in_data).data),opt);
      pLVar4 = this->activation;
      iVar68 = 0;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,local_3f0,opt);
      }
    }
    else {
      iVar68 = 0;
      requantize_from_int32_to_int8
                (&local_628,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var3),
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->scale_in_data).data),
                 *(int *)(p_Var3 + 0x24 + (long)&(this->weight_winograd43_data).data),
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->weight_winograd43_data).data),opt);
    }
  }
  piVar61 = (int *)CONCAT44(local_628.refcount._4_4_,local_628.refcount._0_4_);
  if (piVar61 != (int *)0x0) {
    LOCK();
    *piVar61 = *piVar61 + -1;
    UNLOCK();
    if (*piVar61 == 0) {
      if (local_628.allocator == (Allocator *)0x0) {
        free(local_628.data);
      }
      else {
        (**(code **)(*(long *)local_628.allocator + 0x18))();
      }
    }
  }
LAB_001cb759:
  piVar61 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
  if (piVar61 != (int *)0x0) {
    LOCK();
    *piVar61 = *piVar61 + -1;
    UNLOCK();
    if (*piVar61 == 0) {
      if (local_698.allocator == (Allocator *)0x0) {
        free(local_698.data);
      }
      else {
        (**(code **)(*(long *)local_698.allocator + 0x18))();
      }
    }
  }
  if (local_148.refcount != (int *)0x0) {
    LOCK();
    *local_148.refcount = *local_148.refcount + -1;
    UNLOCK();
    if (*local_148.refcount == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (**(code **)(*(long *)local_148.allocator + 0x18))();
      }
    }
  }
  return iVar68;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}